

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  uint uVar70;
  float fVar71;
  float fVar95;
  float fVar97;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar96;
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 extraout_var [56];
  float fVar98;
  float fVar127;
  float fVar128;
  vint4 bi;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar99;
  float fVar129;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar150;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar175;
  float fVar177;
  vint4 ai_1;
  undefined1 auVar153 [16];
  float fVar179;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar152;
  float fVar176;
  float fVar178;
  float fVar180;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar181;
  float fVar182;
  float fVar200;
  float fVar203;
  vint4 ai_2;
  undefined1 auVar183 [16];
  float fVar205;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar201;
  float fVar204;
  float fVar206;
  undefined1 auVar197 [32];
  float fVar202;
  float fVar207;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar208;
  float fVar222;
  float fVar223;
  undefined1 auVar209 [16];
  float fVar224;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar237;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar230 [16];
  float fVar238;
  float fVar239;
  undefined1 auVar236 [32];
  vint4 ai;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar286;
  float fVar287;
  undefined1 auVar285 [32];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  float fVar301;
  float fVar309;
  float fVar310;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar311;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar322;
  float fVar323;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar324;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar335 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar339;
  float fVar340;
  undefined1 auVar338 [32];
  float fVar341;
  float fVar347;
  float fVar348;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  vfloat4 a0;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar355 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_428;
  Primitive *local_420;
  ulong local_418;
  long local_410;
  RTCFilterFunctionNArguments local_408;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  uint auStack_378 [4];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar174 [32];
  undefined1 auVar354 [32];
  
  PVar7 = prim[1];
  uVar66 = (ulong)(byte)PVar7;
  lVar67 = uVar66 * 0x25;
  fVar98 = *(float *)(prim + lVar67 + 0x12);
  auVar115 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar115 = vinsertps_avx(auVar115,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar293 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar293 = vinsertps_avx(auVar293,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar115 = vsubps_avx(auVar115,*(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar100._0_4_ = fVar98 * auVar115._0_4_;
  auVar100._4_4_ = fVar98 * auVar115._4_4_;
  auVar100._8_4_ = fVar98 * auVar115._8_4_;
  auVar100._12_4_ = fVar98 * auVar115._12_4_;
  auVar240._0_4_ = fVar98 * auVar293._0_4_;
  auVar240._4_4_ = fVar98 * auVar293._4_4_;
  auVar240._8_4_ = fVar98 * auVar293._8_4_;
  auVar240._12_4_ = fVar98 * auVar293._12_4_;
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar293 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar220 = vcvtdq2ps_avx(auVar220);
  auVar261 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xf + 6)));
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar66 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1a + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1b + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x1c + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar88 = vshufps_avx(auVar240,auVar240,0);
  auVar142 = vshufps_avx(auVar240,auVar240,0x55);
  auVar15 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar98 = auVar15._0_4_;
  fVar71 = auVar15._4_4_;
  fVar95 = auVar15._8_4_;
  fVar97 = auVar15._12_4_;
  fVar181 = auVar142._0_4_;
  fVar200 = auVar142._4_4_;
  fVar203 = auVar142._8_4_;
  fVar205 = auVar142._12_4_;
  fVar151 = auVar88._0_4_;
  fVar175 = auVar88._4_4_;
  fVar177 = auVar88._8_4_;
  fVar179 = auVar88._12_4_;
  auVar316._0_4_ = fVar151 * auVar115._0_4_ + fVar181 * auVar293._0_4_ + fVar98 * auVar220._0_4_;
  auVar316._4_4_ = fVar175 * auVar115._4_4_ + fVar200 * auVar293._4_4_ + fVar71 * auVar220._4_4_;
  auVar316._8_4_ = fVar177 * auVar115._8_4_ + fVar203 * auVar293._8_4_ + fVar95 * auVar220._8_4_;
  auVar316._12_4_ = fVar179 * auVar115._12_4_ + fVar205 * auVar293._12_4_ + fVar97 * auVar220._12_4_
  ;
  auVar332._0_4_ = fVar151 * auVar261._0_4_ + fVar181 * auVar14._0_4_ + auVar138._0_4_ * fVar98;
  auVar332._4_4_ = fVar175 * auVar261._4_4_ + fVar200 * auVar14._4_4_ + auVar138._4_4_ * fVar71;
  auVar332._8_4_ = fVar177 * auVar261._8_4_ + fVar203 * auVar14._8_4_ + auVar138._8_4_ * fVar95;
  auVar332._12_4_ = fVar179 * auVar261._12_4_ + fVar205 * auVar14._12_4_ + auVar138._12_4_ * fVar97;
  auVar241._0_4_ = fVar151 * auVar168._0_4_ + fVar181 * auVar114._0_4_ + auVar167._0_4_ * fVar98;
  auVar241._4_4_ = fVar175 * auVar168._4_4_ + fVar200 * auVar114._4_4_ + auVar167._4_4_ * fVar71;
  auVar241._8_4_ = fVar177 * auVar168._8_4_ + fVar203 * auVar114._8_4_ + auVar167._8_4_ * fVar95;
  auVar241._12_4_ = fVar179 * auVar168._12_4_ + fVar205 * auVar114._12_4_ + auVar167._12_4_ * fVar97
  ;
  auVar88 = vshufps_avx(auVar100,auVar100,0);
  auVar142 = vshufps_avx(auVar100,auVar100,0x55);
  auVar15 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar98 = auVar15._0_4_;
  fVar71 = auVar15._4_4_;
  fVar95 = auVar15._8_4_;
  fVar97 = auVar15._12_4_;
  fVar181 = auVar142._0_4_;
  fVar200 = auVar142._4_4_;
  fVar203 = auVar142._8_4_;
  fVar205 = auVar142._12_4_;
  fVar151 = auVar88._0_4_;
  fVar175 = auVar88._4_4_;
  fVar177 = auVar88._8_4_;
  fVar179 = auVar88._12_4_;
  auVar101._0_4_ = fVar151 * auVar115._0_4_ + fVar181 * auVar293._0_4_ + fVar98 * auVar220._0_4_;
  auVar101._4_4_ = fVar175 * auVar115._4_4_ + fVar200 * auVar293._4_4_ + fVar71 * auVar220._4_4_;
  auVar101._8_4_ = fVar177 * auVar115._8_4_ + fVar203 * auVar293._8_4_ + fVar95 * auVar220._8_4_;
  auVar101._12_4_ = fVar179 * auVar115._12_4_ + fVar205 * auVar293._12_4_ + fVar97 * auVar220._12_4_
  ;
  auVar72._0_4_ = fVar151 * auVar261._0_4_ + auVar138._0_4_ * fVar98 + fVar181 * auVar14._0_4_;
  auVar72._4_4_ = fVar175 * auVar261._4_4_ + auVar138._4_4_ * fVar71 + fVar200 * auVar14._4_4_;
  auVar72._8_4_ = fVar177 * auVar261._8_4_ + auVar138._8_4_ * fVar95 + fVar203 * auVar14._8_4_;
  auVar72._12_4_ = fVar179 * auVar261._12_4_ + auVar138._12_4_ * fVar97 + fVar205 * auVar14._12_4_;
  auVar252._8_4_ = 0x7fffffff;
  auVar252._0_8_ = 0x7fffffff7fffffff;
  auVar252._12_4_ = 0x7fffffff;
  auVar115 = vandps_avx(auVar316,auVar252);
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar115 = vcmpps_avx(auVar115,auVar183,1);
  auVar293 = vblendvps_avx(auVar316,auVar183,auVar115);
  auVar115 = vandps_avx(auVar332,auVar252);
  auVar115 = vcmpps_avx(auVar115,auVar183,1);
  auVar220 = vblendvps_avx(auVar332,auVar183,auVar115);
  auVar115 = vandps_avx(auVar252,auVar241);
  auVar115 = vcmpps_avx(auVar115,auVar183,1);
  auVar115 = vblendvps_avx(auVar241,auVar183,auVar115);
  auVar130._0_4_ = fVar151 * auVar168._0_4_ + fVar181 * auVar114._0_4_ + auVar167._0_4_ * fVar98;
  auVar130._4_4_ = fVar175 * auVar168._4_4_ + fVar200 * auVar114._4_4_ + auVar167._4_4_ * fVar71;
  auVar130._8_4_ = fVar177 * auVar168._8_4_ + fVar203 * auVar114._8_4_ + auVar167._8_4_ * fVar95;
  auVar130._12_4_ = fVar179 * auVar168._12_4_ + fVar205 * auVar114._12_4_ + auVar167._12_4_ * fVar97
  ;
  auVar261 = vrcpps_avx(auVar293);
  fVar151 = auVar261._0_4_;
  auVar153._0_4_ = fVar151 * auVar293._0_4_;
  fVar175 = auVar261._4_4_;
  auVar153._4_4_ = fVar175 * auVar293._4_4_;
  fVar177 = auVar261._8_4_;
  auVar153._8_4_ = fVar177 * auVar293._8_4_;
  fVar179 = auVar261._12_4_;
  auVar153._12_4_ = fVar179 * auVar293._12_4_;
  auVar253._8_4_ = 0x3f800000;
  auVar253._0_8_ = &DAT_3f8000003f800000;
  auVar253._12_4_ = 0x3f800000;
  auVar293 = vsubps_avx(auVar253,auVar153);
  fVar151 = fVar151 + fVar151 * auVar293._0_4_;
  fVar175 = fVar175 + fVar175 * auVar293._4_4_;
  fVar177 = fVar177 + fVar177 * auVar293._8_4_;
  fVar179 = fVar179 + fVar179 * auVar293._12_4_;
  auVar293 = vrcpps_avx(auVar220);
  fVar181 = auVar293._0_4_;
  auVar209._0_4_ = fVar181 * auVar220._0_4_;
  fVar200 = auVar293._4_4_;
  auVar209._4_4_ = fVar200 * auVar220._4_4_;
  fVar203 = auVar293._8_4_;
  auVar209._8_4_ = fVar203 * auVar220._8_4_;
  fVar205 = auVar293._12_4_;
  auVar209._12_4_ = fVar205 * auVar220._12_4_;
  auVar293 = vsubps_avx(auVar253,auVar209);
  fVar181 = fVar181 + fVar181 * auVar293._0_4_;
  fVar200 = fVar200 + fVar200 * auVar293._4_4_;
  fVar203 = fVar203 + fVar203 * auVar293._8_4_;
  fVar205 = fVar205 + fVar205 * auVar293._12_4_;
  auVar293 = vrcpps_avx(auVar115);
  fVar208 = auVar293._0_4_;
  auVar225._0_4_ = fVar208 * auVar115._0_4_;
  fVar222 = auVar293._4_4_;
  auVar225._4_4_ = fVar222 * auVar115._4_4_;
  fVar223 = auVar293._8_4_;
  auVar225._8_4_ = fVar223 * auVar115._8_4_;
  fVar224 = auVar293._12_4_;
  auVar225._12_4_ = fVar224 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar253,auVar225);
  fVar208 = fVar208 + fVar208 * auVar115._0_4_;
  fVar222 = fVar222 + fVar222 * auVar115._4_4_;
  fVar223 = fVar223 + fVar223 * auVar115._8_4_;
  fVar224 = fVar224 + fVar224 * auVar115._12_4_;
  auVar115 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar67 + 0x16)) *
                           *(float *)(prim + lVar67 + 0x1a)));
  auVar220 = vshufps_avx(auVar115,auVar115,0);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar115 = vpmovsxwd_avx(auVar115);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar293 = vpmovsxwd_avx(auVar293);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar261 = vsubps_avx(auVar293,auVar115);
  fVar98 = auVar220._0_4_;
  fVar71 = auVar220._4_4_;
  fVar95 = auVar220._8_4_;
  fVar97 = auVar220._12_4_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar293 = vpmovsxwd_avx(auVar220);
  auVar242._0_4_ = auVar261._0_4_ * fVar98 + auVar115._0_4_;
  auVar242._4_4_ = auVar261._4_4_ * fVar71 + auVar115._4_4_;
  auVar242._8_4_ = auVar261._8_4_ * fVar95 + auVar115._8_4_;
  auVar242._12_4_ = auVar261._12_4_ * fVar97 + auVar115._12_4_;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + uVar66 * 0xd + 6);
  auVar220 = vpmovsxwd_avx(auVar261);
  auVar115 = vcvtdq2ps_avx(auVar293);
  auVar293 = vcvtdq2ps_avx(auVar220);
  auVar293 = vsubps_avx(auVar293,auVar115);
  auVar254._0_4_ = auVar293._0_4_ * fVar98 + auVar115._0_4_;
  auVar254._4_4_ = auVar293._4_4_ * fVar71 + auVar115._4_4_;
  auVar254._8_4_ = auVar293._8_4_ * fVar95 + auVar115._8_4_;
  auVar254._12_4_ = auVar293._12_4_ * fVar97 + auVar115._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar66 * 0x12 + 6);
  auVar115 = vpmovsxwd_avx(auVar14);
  uVar68 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar66 * 2 + uVar68 + 6);
  auVar293 = vpmovsxwd_avx(auVar138);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar293 = vsubps_avx(auVar293,auVar115);
  auVar273._0_4_ = auVar293._0_4_ * fVar98 + auVar115._0_4_;
  auVar273._4_4_ = auVar293._4_4_ * fVar71 + auVar115._4_4_;
  auVar273._8_4_ = auVar293._8_4_ * fVar95 + auVar115._8_4_;
  auVar273._12_4_ = auVar293._12_4_ * fVar97 + auVar115._12_4_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar115 = vpmovsxwd_avx(auVar168);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar66 * 0x18 + 6);
  auVar293 = vpmovsxwd_avx(auVar114);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar220 = vsubps_avx(auVar293,auVar115);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar66 * 0x1d + 6);
  auVar293 = vpmovsxwd_avx(auVar167);
  auVar288._0_4_ = auVar220._0_4_ * fVar98 + auVar115._0_4_;
  auVar288._4_4_ = auVar220._4_4_ * fVar71 + auVar115._4_4_;
  auVar288._8_4_ = auVar220._8_4_ * fVar95 + auVar115._8_4_;
  auVar288._12_4_ = auVar220._12_4_ * fVar97 + auVar115._12_4_;
  auVar115 = vcvtdq2ps_avx(auVar293);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar66 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar293 = vpmovsxwd_avx(auVar88);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar293 = vsubps_avx(auVar293,auVar115);
  auVar302._0_4_ = auVar293._0_4_ * fVar98 + auVar115._0_4_;
  auVar302._4_4_ = auVar293._4_4_ * fVar71 + auVar115._4_4_;
  auVar302._8_4_ = auVar293._8_4_ * fVar95 + auVar115._8_4_;
  auVar302._12_4_ = auVar293._12_4_ * fVar97 + auVar115._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar66) + 6);
  auVar115 = vpmovsxwd_avx(auVar142);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar66 * 0x23 + 6);
  auVar293 = vpmovsxwd_avx(auVar15);
  auVar293 = vcvtdq2ps_avx(auVar293);
  auVar293 = vsubps_avx(auVar293,auVar115);
  auVar226._0_4_ = auVar115._0_4_ + auVar293._0_4_ * fVar98;
  auVar226._4_4_ = auVar115._4_4_ + auVar293._4_4_ * fVar71;
  auVar226._8_4_ = auVar115._8_4_ + auVar293._8_4_ * fVar95;
  auVar226._12_4_ = auVar115._12_4_ + auVar293._12_4_ * fVar97;
  auVar115 = vsubps_avx(auVar242,auVar101);
  auVar243._0_4_ = fVar151 * auVar115._0_4_;
  auVar243._4_4_ = fVar175 * auVar115._4_4_;
  auVar243._8_4_ = fVar177 * auVar115._8_4_;
  auVar243._12_4_ = fVar179 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar254,auVar101);
  auVar102._0_4_ = fVar151 * auVar115._0_4_;
  auVar102._4_4_ = fVar175 * auVar115._4_4_;
  auVar102._8_4_ = fVar177 * auVar115._8_4_;
  auVar102._12_4_ = fVar179 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar273,auVar72);
  auVar154._0_4_ = fVar181 * auVar115._0_4_;
  auVar154._4_4_ = fVar200 * auVar115._4_4_;
  auVar154._8_4_ = fVar203 * auVar115._8_4_;
  auVar154._12_4_ = fVar205 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar288,auVar72);
  auVar73._0_4_ = fVar181 * auVar115._0_4_;
  auVar73._4_4_ = fVar200 * auVar115._4_4_;
  auVar73._8_4_ = fVar203 * auVar115._8_4_;
  auVar73._12_4_ = fVar205 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar302,auVar130);
  auVar184._0_4_ = fVar208 * auVar115._0_4_;
  auVar184._4_4_ = fVar222 * auVar115._4_4_;
  auVar184._8_4_ = fVar223 * auVar115._8_4_;
  auVar184._12_4_ = fVar224 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar226,auVar130);
  auVar131._0_4_ = fVar208 * auVar115._0_4_;
  auVar131._4_4_ = fVar222 * auVar115._4_4_;
  auVar131._8_4_ = fVar223 * auVar115._8_4_;
  auVar131._12_4_ = fVar224 * auVar115._12_4_;
  auVar115 = vpminsd_avx(auVar243,auVar102);
  auVar293 = vpminsd_avx(auVar154,auVar73);
  auVar115 = vmaxps_avx(auVar115,auVar293);
  auVar293 = vpminsd_avx(auVar184,auVar131);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar255._4_4_ = uVar5;
  auVar255._0_4_ = uVar5;
  auVar255._8_4_ = uVar5;
  auVar255._12_4_ = uVar5;
  auVar293 = vmaxps_avx(auVar293,auVar255);
  auVar115 = vmaxps_avx(auVar115,auVar293);
  local_348._0_4_ = auVar115._0_4_ * 0.99999964;
  local_348._4_4_ = auVar115._4_4_ * 0.99999964;
  local_348._8_4_ = auVar115._8_4_ * 0.99999964;
  local_348._12_4_ = auVar115._12_4_ * 0.99999964;
  auVar115 = vpmaxsd_avx(auVar243,auVar102);
  auVar293 = vpmaxsd_avx(auVar154,auVar73);
  auVar115 = vminps_avx(auVar115,auVar293);
  auVar293 = vpmaxsd_avx(auVar184,auVar131);
  uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar5;
  auVar132._0_4_ = uVar5;
  auVar132._8_4_ = uVar5;
  auVar132._12_4_ = uVar5;
  auVar293 = vminps_avx(auVar293,auVar132);
  auVar115 = vminps_avx(auVar115,auVar293);
  auVar74._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar115 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar293 = vpcmpgtd_avx(auVar115,_DAT_01ff0cf0);
  auVar115 = vcmpps_avx(local_348,auVar74,2);
  auVar115 = vandps_avx(auVar115,auVar293);
  uVar63 = vmovmskps_avx(auVar115);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_428 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar355 = ZEXT464(0) << 0x20;
  local_420 = prim;
LAB_0108de2f:
  lVar67 = 0;
  if ((ulong)uVar63 != 0) {
    for (; (uVar63 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar65 = *(uint *)(local_420 + 2);
  local_418 = (ulong)*(uint *)(local_420 + lVar67 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar65].ptr;
  fVar98 = (pGVar8->time_range).lower;
  fVar98 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar98) / ((pGVar8->time_range).upper - fVar98));
  auVar115 = vroundss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),9);
  auVar115 = vminss_avx(auVar115,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar293 = vmaxss_avx(ZEXT816(0) << 0x20,auVar115);
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_418 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar69 = (long)(int)auVar293._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar69);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar69);
  pfVar4 = (float *)(lVar10 + lVar11 * uVar66);
  fVar71 = *pfVar4;
  fVar95 = pfVar4[1];
  fVar97 = pfVar4[2];
  fVar151 = pfVar4[3];
  lVar1 = uVar66 + 1;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar1);
  fVar175 = *pfVar4;
  fVar177 = pfVar4[1];
  fVar179 = pfVar4[2];
  fVar181 = pfVar4[3];
  lVar2 = uVar66 + 2;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar200 = *pfVar4;
  fVar203 = pfVar4[1];
  fVar205 = pfVar4[2];
  fVar208 = pfVar4[3];
  lVar3 = uVar66 + 3;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar3);
  fVar222 = *pfVar4;
  fVar223 = pfVar4[1];
  fVar224 = pfVar4[2];
  fVar96 = pfVar4[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar69);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar69);
  auVar115 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar66);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar152 = *pfVar4;
  fVar176 = pfVar4[1];
  fVar178 = pfVar4[2];
  fVar180 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar182 = *pfVar4;
  fVar201 = pfVar4[1];
  fVar204 = pfVar4[2];
  fVar206 = pfVar4[3];
  fVar98 = fVar98 - auVar293._0_4_;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar150 = *pfVar4;
  fVar286 = pfVar4[1];
  fVar287 = pfVar4[2];
  fVar301 = pfVar4[3];
  fVar309 = auVar355._8_4_;
  fVar202 = auVar355._12_4_;
  auVar75._0_4_ = fVar175 * 0.0 + fVar200 * 0.5 + fVar222 * 0.0;
  auVar75._4_4_ = fVar177 * 0.0 + fVar203 * 0.5 + fVar223 * 0.0;
  auVar75._8_4_ = fVar309 * fVar179 + fVar205 * 0.5 + fVar224 * fVar309;
  auVar75._12_4_ = fVar202 * fVar181 + fVar208 * 0.5 + fVar96 * fVar202;
  auVar133._0_4_ = fVar71 * 0.5;
  auVar133._4_4_ = fVar95 * 0.5;
  auVar133._8_4_ = fVar97 * 0.5;
  auVar133._12_4_ = fVar151 * 0.5;
  auVar114 = vsubps_avx(auVar75,auVar133);
  auVar76._0_4_ = fVar152 * 0.0 + fVar182 * 0.5 + fVar150 * 0.0;
  auVar76._4_4_ = fVar176 * 0.0 + fVar201 * 0.5 + fVar286 * 0.0;
  auVar76._8_4_ = fVar178 * fVar309 + fVar204 * 0.5 + fVar287 * fVar309;
  auVar76._12_4_ = fVar180 * fVar202 + fVar206 * 0.5 + fVar301 * fVar202;
  fVar99 = auVar115._0_4_;
  auVar342._0_4_ = fVar99 * 0.5;
  fVar127 = auVar115._4_4_;
  auVar342._4_4_ = fVar127 * 0.5;
  fVar128 = auVar115._8_4_;
  auVar342._8_4_ = fVar128 * 0.5;
  fVar129 = auVar115._12_4_;
  auVar342._12_4_ = fVar129 * 0.5;
  auVar261 = vsubps_avx(auVar76,auVar342);
  local_5e8._0_4_ = fVar71 * -0.0 + fVar200 * 0.0 + fVar222 * -0.0 + fVar175;
  local_5e8._4_4_ = fVar95 * -0.0 + fVar203 * 0.0 + fVar223 * -0.0 + fVar177;
  fStack_5e0 = fVar97 * -0.0 + fVar309 * fVar205 + fVar224 * -0.0 + fVar179;
  fStack_5dc = fVar151 * -0.0 + fVar202 * fVar208 + fVar96 * -0.0 + fVar181;
  local_5a8._0_4_ = fVar71 * -0.0 + fVar175 * 0.0 + fVar200 + fVar222 * -0.0;
  local_5a8._4_4_ = fVar95 * -0.0 + fVar177 * 0.0 + fVar203 + fVar223 * -0.0;
  fStack_5a0 = fVar97 * -0.0 + fVar309 * fVar179 + fVar205 + fVar224 * -0.0;
  fStack_59c = fVar151 * -0.0 + fVar202 * fVar181 + fVar208 + fVar96 * -0.0;
  auVar256._0_4_ = fVar200 * 0.0 + fVar222 * 0.5;
  auVar256._4_4_ = fVar203 * 0.0 + fVar223 * 0.5;
  auVar256._8_4_ = fVar309 * fVar205 + fVar224 * 0.5;
  auVar256._12_4_ = fVar202 * fVar208 + fVar96 * 0.5;
  auVar185._0_4_ = fVar175 * 0.5;
  auVar185._4_4_ = fVar177 * 0.5;
  auVar185._8_4_ = fVar179 * 0.5;
  auVar185._12_4_ = fVar181 * 0.5;
  auVar115 = vsubps_avx(auVar256,auVar185);
  auVar349._0_4_ = fVar99 * -0.0 + fVar182 * 0.0 + fVar150 * -0.0 + fVar152;
  auVar349._4_4_ = fVar127 * -0.0 + fVar201 * 0.0 + fVar286 * -0.0 + fVar176;
  auVar349._8_4_ = fVar128 * -0.0 + fVar204 * 0.0 + fVar287 * -0.0 + fVar178;
  auVar349._12_4_ = fVar129 * -0.0 + fVar206 * 0.0 + fVar301 * -0.0 + fVar180;
  auVar274._0_4_ = fVar71 * 0.0 + auVar115._0_4_;
  auVar274._4_4_ = fVar95 * 0.0 + auVar115._4_4_;
  auVar274._8_4_ = fVar97 * 0.0 + auVar115._8_4_;
  auVar274._12_4_ = fVar151 * 0.0 + auVar115._12_4_;
  auVar155._0_4_ = fVar99 * -0.0 + fVar152 * 0.0 + fVar182 + fVar150 * -0.0;
  auVar155._4_4_ = fVar127 * -0.0 + fVar176 * 0.0 + fVar201 + fVar286 * -0.0;
  auVar155._8_4_ = fVar128 * -0.0 + fVar178 * fVar309 + fVar204 + fVar287 * -0.0;
  auVar155._12_4_ = fVar129 * -0.0 + fVar180 * fVar202 + fVar206 + fVar301 * -0.0;
  auVar186._0_4_ = fVar182 * 0.0 + fVar150 * 0.5;
  auVar186._4_4_ = fVar201 * 0.0 + fVar286 * 0.5;
  auVar186._8_4_ = fVar204 * 0.0 + fVar287 * 0.5;
  auVar186._12_4_ = fVar206 * 0.0 + fVar301 * 0.5;
  auVar244._0_4_ = fVar152 * 0.5;
  auVar244._4_4_ = fVar176 * 0.5;
  auVar244._8_4_ = fVar178 * 0.5;
  auVar244._12_4_ = fVar180 * 0.5;
  auVar115 = vsubps_avx(auVar186,auVar244);
  auVar187._0_4_ = fVar99 * 0.0 + auVar115._0_4_;
  auVar187._4_4_ = fVar127 * 0.0 + auVar115._4_4_;
  auVar187._8_4_ = fVar128 * 0.0 + auVar115._8_4_;
  auVar187._12_4_ = fVar129 * 0.0 + auVar115._12_4_;
  auVar115 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar293 = vshufps_avx(auVar349,auVar349,0xc9);
  fVar309 = auVar114._0_4_;
  auVar210._0_4_ = fVar309 * auVar293._0_4_;
  fVar202 = auVar114._4_4_;
  auVar210._4_4_ = fVar202 * auVar293._4_4_;
  fVar310 = auVar114._8_4_;
  auVar210._8_4_ = fVar310 * auVar293._8_4_;
  fVar207 = auVar114._12_4_;
  auVar210._12_4_ = fVar207 * auVar293._12_4_;
  auVar257._0_4_ = auVar349._0_4_ * auVar115._0_4_;
  auVar257._4_4_ = auVar349._4_4_ * auVar115._4_4_;
  auVar257._8_4_ = auVar349._8_4_ * auVar115._8_4_;
  auVar257._12_4_ = auVar349._12_4_ * auVar115._12_4_;
  auVar293 = vsubps_avx(auVar257,auVar210);
  auVar220 = vshufps_avx(auVar293,auVar293,0xc9);
  auVar293 = vshufps_avx(auVar261,auVar261,0xc9);
  auVar258._0_4_ = auVar293._0_4_ * fVar309;
  auVar258._4_4_ = auVar293._4_4_ * fVar202;
  auVar258._8_4_ = auVar293._8_4_ * fVar310;
  auVar258._12_4_ = auVar293._12_4_ * fVar207;
  auVar77._0_4_ = auVar115._0_4_ * auVar261._0_4_;
  auVar77._4_4_ = auVar115._4_4_ * auVar261._4_4_;
  auVar77._8_4_ = auVar115._8_4_ * auVar261._8_4_;
  auVar77._12_4_ = auVar115._12_4_ * auVar261._12_4_;
  auVar115 = vsubps_avx(auVar77,auVar258);
  auVar261 = vshufps_avx(auVar115,auVar115,0xc9);
  auVar115 = vshufps_avx(auVar274,auVar274,0xc9);
  auVar293 = vshufps_avx(auVar155,auVar155,0xc9);
  auVar259._0_4_ = auVar274._0_4_ * auVar293._0_4_;
  auVar259._4_4_ = auVar274._4_4_ * auVar293._4_4_;
  auVar259._8_4_ = auVar274._8_4_ * auVar293._8_4_;
  auVar259._12_4_ = auVar274._12_4_ * auVar293._12_4_;
  auVar156._0_4_ = auVar115._0_4_ * auVar155._0_4_;
  auVar156._4_4_ = auVar115._4_4_ * auVar155._4_4_;
  auVar156._8_4_ = auVar115._8_4_ * auVar155._8_4_;
  auVar156._12_4_ = auVar115._12_4_ * auVar155._12_4_;
  auVar293 = vsubps_avx(auVar156,auVar259);
  auVar14 = vshufps_avx(auVar293,auVar293,0xc9);
  auVar293 = vshufps_avx(auVar187,auVar187,0xc9);
  auVar260._0_4_ = auVar274._0_4_ * auVar293._0_4_;
  auVar260._4_4_ = auVar274._4_4_ * auVar293._4_4_;
  auVar260._8_4_ = auVar274._8_4_ * auVar293._8_4_;
  auVar260._12_4_ = auVar274._12_4_ * auVar293._12_4_;
  auVar188._0_4_ = auVar115._0_4_ * auVar187._0_4_;
  auVar188._4_4_ = auVar115._4_4_ * auVar187._4_4_;
  auVar188._8_4_ = auVar115._8_4_ * auVar187._8_4_;
  auVar188._12_4_ = auVar115._12_4_ * auVar187._12_4_;
  auVar115 = vsubps_avx(auVar188,auVar260);
  auVar138 = vshufps_avx(auVar115,auVar115,0xc9);
  auVar115 = vdpps_avx(auVar220,auVar220,0x7f);
  fVar95 = auVar115._0_4_;
  auVar88 = ZEXT416((uint)fVar95);
  auVar293 = vrsqrtss_avx(auVar88,auVar88);
  fVar71 = auVar293._0_4_;
  auVar293 = vdpps_avx(auVar220,auVar261,0x7f);
  auVar168 = ZEXT416((uint)(fVar71 * 1.5 - fVar95 * 0.5 * fVar71 * fVar71 * fVar71));
  auVar168 = vshufps_avx(auVar168,auVar168,0);
  fVar182 = auVar168._0_4_ * auVar220._0_4_;
  fVar201 = auVar168._4_4_ * auVar220._4_4_;
  fVar204 = auVar168._8_4_ * auVar220._8_4_;
  fVar206 = auVar168._12_4_ * auVar220._12_4_;
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  auVar78._0_4_ = auVar115._0_4_ * auVar261._0_4_;
  auVar78._4_4_ = auVar115._4_4_ * auVar261._4_4_;
  auVar78._8_4_ = auVar115._8_4_ * auVar261._8_4_;
  auVar78._12_4_ = auVar115._12_4_ * auVar261._12_4_;
  auVar115 = vshufps_avx(auVar293,auVar293,0);
  auVar211._0_4_ = auVar115._0_4_ * auVar220._0_4_;
  auVar211._4_4_ = auVar115._4_4_ * auVar220._4_4_;
  auVar211._8_4_ = auVar115._8_4_ * auVar220._8_4_;
  auVar211._12_4_ = auVar115._12_4_ * auVar220._12_4_;
  auVar167 = vsubps_avx(auVar78,auVar211);
  auVar115 = vrcpss_avx(auVar88,auVar88);
  auVar115 = ZEXT416((uint)(auVar115._0_4_ * (2.0 - fVar95 * auVar115._0_4_)));
  auVar220 = vshufps_avx(auVar115,auVar115,0);
  auVar115 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar150 = auVar115._0_4_;
  auVar261 = ZEXT416((uint)fVar150);
  auVar293 = vrsqrtss_avx(auVar261,auVar261);
  fVar152 = auVar293._0_4_;
  auVar293 = vdpps_avx(auVar14,auVar138,0x7f);
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  auVar350._0_4_ = auVar138._0_4_ * auVar115._0_4_;
  auVar350._4_4_ = auVar138._4_4_ * auVar115._4_4_;
  auVar350._8_4_ = auVar138._8_4_ * auVar115._8_4_;
  auVar350._12_4_ = auVar138._12_4_ * auVar115._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar69);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar69);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar66);
  fVar71 = *pfVar4;
  fVar95 = pfVar4[1];
  fVar97 = pfVar4[2];
  fVar151 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar175 = *pfVar4;
  fVar177 = pfVar4[1];
  fVar179 = pfVar4[2];
  fVar181 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar200 = *pfVar4;
  fVar203 = pfVar4[1];
  fVar205 = pfVar4[2];
  fVar208 = pfVar4[3];
  auVar115 = vshufps_avx(auVar293,auVar293,0);
  auVar79._0_4_ = auVar115._0_4_ * auVar14._0_4_;
  auVar79._4_4_ = auVar115._4_4_ * auVar14._4_4_;
  auVar79._8_4_ = auVar115._8_4_ * auVar14._8_4_;
  auVar79._12_4_ = auVar115._12_4_ * auVar14._12_4_;
  auVar138 = vsubps_avx(auVar350,auVar79);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar222 = *pfVar4;
  fVar223 = pfVar4[1];
  fVar224 = pfVar4[2];
  fVar96 = pfVar4[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar69);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar69);
  auVar115 = ZEXT416((uint)(fVar152 * 1.5 - fVar150 * 0.5 * fVar152 * fVar152 * fVar152));
  auVar293 = vshufps_avx(auVar115,auVar115,0);
  fVar152 = auVar293._0_4_ * auVar14._0_4_;
  fVar176 = auVar293._4_4_ * auVar14._4_4_;
  fVar178 = auVar293._8_4_ * auVar14._8_4_;
  fVar180 = auVar293._12_4_ * auVar14._12_4_;
  auVar115 = vrcpss_avx(auVar261,auVar261);
  auVar115 = ZEXT416((uint)(auVar115._0_4_ * (2.0 - auVar115._0_4_ * fVar150)));
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  auVar261 = vshufps_avx(_local_5e8,_local_5e8,0xff);
  auVar317._0_4_ = auVar261._0_4_ * fVar182;
  auVar317._4_4_ = auVar261._4_4_ * fVar201;
  auVar317._8_4_ = auVar261._8_4_ * fVar204;
  auVar317._12_4_ = auVar261._12_4_ * fVar206;
  auVar14 = vshufps_avx(auVar114,auVar114,0xff);
  auVar88 = vsubps_avx(_local_5e8,auVar317);
  auVar245._0_4_ =
       auVar14._0_4_ * fVar182 + auVar261._0_4_ * auVar168._0_4_ * auVar167._0_4_ * auVar220._0_4_;
  auVar245._4_4_ =
       auVar14._4_4_ * fVar201 + auVar261._4_4_ * auVar168._4_4_ * auVar167._4_4_ * auVar220._4_4_;
  auVar245._8_4_ =
       auVar14._8_4_ * fVar204 + auVar261._8_4_ * auVar168._8_4_ * auVar167._8_4_ * auVar220._8_4_;
  auVar245._12_4_ =
       auVar14._12_4_ * fVar206 +
       auVar261._12_4_ * auVar168._12_4_ * auVar167._12_4_ * auVar220._12_4_;
  auVar167 = vsubps_avx(auVar114,auVar245);
  local_5e8._0_4_ = auVar317._0_4_ + (float)local_5e8._0_4_;
  local_5e8._4_4_ = auVar317._4_4_ + (float)local_5e8._4_4_;
  fStack_5e0 = auVar317._8_4_ + fStack_5e0;
  fStack_5dc = auVar317._12_4_ + fStack_5dc;
  auVar220 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar134._0_4_ = auVar220._0_4_ * fVar152;
  auVar134._4_4_ = auVar220._4_4_ * fVar176;
  auVar134._8_4_ = auVar220._8_4_ * fVar178;
  auVar134._12_4_ = auVar220._12_4_ * fVar180;
  auVar261 = vshufps_avx(auVar274,auVar274,0xff);
  auVar142 = vsubps_avx(_local_5a8,auVar134);
  auVar80._0_4_ =
       auVar261._0_4_ * fVar152 + auVar220._0_4_ * auVar293._0_4_ * auVar138._0_4_ * auVar115._0_4_;
  auVar80._4_4_ =
       auVar261._4_4_ * fVar176 + auVar220._4_4_ * auVar293._4_4_ * auVar138._4_4_ * auVar115._4_4_;
  auVar80._8_4_ =
       auVar261._8_4_ * fVar178 + auVar220._8_4_ * auVar293._8_4_ * auVar138._8_4_ * auVar115._8_4_;
  auVar80._12_4_ =
       auVar261._12_4_ * fVar180 +
       auVar220._12_4_ * auVar293._12_4_ * auVar138._12_4_ * auVar115._12_4_;
  auVar15 = vsubps_avx(auVar274,auVar80);
  local_5a8._0_4_ = (float)local_5a8._0_4_ + auVar134._0_4_;
  local_5a8._4_4_ = (float)local_5a8._4_4_ + auVar134._4_4_;
  fStack_5a0 = fStack_5a0 + auVar134._8_4_;
  fStack_59c = fStack_59c + auVar134._12_4_;
  auVar81._0_4_ = fVar175 * 0.0 + fVar200 * 0.5 + fVar222 * 0.0;
  auVar81._4_4_ = fVar177 * 0.0 + fVar203 * 0.5 + fVar223 * 0.0;
  auVar81._8_4_ = fVar179 * 0.0 + fVar205 * 0.5 + fVar224 * 0.0;
  auVar81._12_4_ = fVar181 * 0.0 + fVar208 * 0.5 + fVar96 * 0.0;
  auVar103._0_4_ = fVar71 * 0.5;
  auVar103._4_4_ = fVar95 * 0.5;
  auVar103._8_4_ = fVar97 * 0.5;
  auVar103._12_4_ = fVar151 * 0.5;
  auVar72 = vsubps_avx(auVar81,auVar103);
  pfVar4 = (float *)(lVar11 + lVar2 * lVar10);
  fVar152 = *pfVar4;
  fVar176 = pfVar4[1];
  fVar178 = pfVar4[2];
  fVar180 = pfVar4[3];
  auVar115 = *(undefined1 (*) [16])(lVar11 + lVar10 * lVar3);
  fVar99 = auVar115._0_4_;
  fVar127 = auVar115._4_4_;
  fVar128 = auVar115._8_4_;
  fVar129 = auVar115._12_4_;
  pfVar4 = (float *)(lVar11 + lVar1 * lVar10);
  fVar182 = *pfVar4;
  fVar201 = pfVar4[1];
  fVar204 = pfVar4[2];
  fVar206 = pfVar4[3];
  auVar227._0_4_ = fVar182 * 0.0 + fVar99 * 0.0 + fVar152 * 0.5;
  auVar227._4_4_ = fVar201 * 0.0 + fVar127 * 0.0 + fVar176 * 0.5;
  auVar227._8_4_ = fVar204 * 0.0 + fVar128 * 0.0 + fVar178 * 0.5;
  auVar227._12_4_ = fVar206 * 0.0 + fVar129 * 0.0 + fVar180 * 0.5;
  pfVar4 = (float *)(lVar11 + uVar66 * lVar10);
  fVar150 = *pfVar4;
  fVar286 = pfVar4[1];
  fVar287 = pfVar4[2];
  fVar301 = pfVar4[3];
  auVar262._0_4_ = fVar150 * 0.5;
  auVar262._4_4_ = fVar286 * 0.5;
  auVar262._8_4_ = fVar287 * 0.5;
  auVar262._12_4_ = fVar301 * 0.5;
  auVar293 = vsubps_avx(auVar227,auVar262);
  auVar263._0_4_ = fVar71 * -0.0 + fVar175 + fVar200 * 0.0 + fVar222 * -0.0;
  auVar263._4_4_ = fVar95 * -0.0 + fVar177 + fVar203 * 0.0 + fVar223 * -0.0;
  auVar263._8_4_ = fVar97 * -0.0 + fVar179 + fVar205 * 0.0 + fVar224 * -0.0;
  auVar263._12_4_ = fVar151 * -0.0 + fVar181 + fVar208 * 0.0 + fVar96 * -0.0;
  local_528._0_4_ = fVar71 * -0.0 + fVar175 * 0.0 + fVar200 + fVar222 * -0.0;
  local_528._4_4_ = fVar95 * -0.0 + fVar177 * 0.0 + fVar203 + fVar223 * -0.0;
  fStack_520 = fVar97 * -0.0 + fVar179 * 0.0 + fVar205 + fVar224 * -0.0;
  fStack_51c = fVar151 * -0.0 + fVar181 * 0.0 + fVar208 + fVar96 * -0.0;
  auVar289._0_4_ = fVar200 * 0.0 + fVar222 * 0.5;
  auVar289._4_4_ = fVar203 * 0.0 + fVar223 * 0.5;
  auVar289._8_4_ = fVar205 * 0.0 + fVar224 * 0.5;
  auVar289._12_4_ = fVar208 * 0.0 + fVar96 * 0.5;
  auVar318._0_4_ = fVar175 * 0.5;
  auVar318._4_4_ = fVar177 * 0.5;
  auVar318._8_4_ = fVar179 * 0.5;
  auVar318._12_4_ = fVar181 * 0.5;
  auVar115 = vsubps_avx(auVar289,auVar318);
  auVar303._0_4_ = fVar71 * 0.0 + auVar115._0_4_;
  auVar303._4_4_ = fVar95 * 0.0 + auVar115._4_4_;
  auVar303._8_4_ = fVar97 * 0.0 + auVar115._8_4_;
  auVar303._12_4_ = fVar151 * 0.0 + auVar115._12_4_;
  auVar290._0_4_ = fVar150 * -0.0 + fVar182 + fVar99 * -0.0 + fVar152 * 0.0;
  auVar290._4_4_ = fVar286 * -0.0 + fVar201 + fVar127 * -0.0 + fVar176 * 0.0;
  auVar290._8_4_ = fVar287 * -0.0 + fVar204 + fVar128 * -0.0 + fVar178 * 0.0;
  auVar290._12_4_ = fVar301 * -0.0 + fVar206 + fVar129 * -0.0 + fVar180 * 0.0;
  auVar104._0_4_ = fVar150 * -0.0 + fVar99 * -0.0 + fVar152 + fVar182 * 0.0;
  auVar104._4_4_ = fVar286 * -0.0 + fVar127 * -0.0 + fVar176 + fVar201 * 0.0;
  auVar104._8_4_ = fVar287 * -0.0 + fVar128 * -0.0 + fVar178 + fVar204 * 0.0;
  auVar104._12_4_ = fVar301 * -0.0 + fVar129 * -0.0 + fVar180 + fVar206 * 0.0;
  auVar135._0_4_ = fVar152 * 0.0 + fVar99 * 0.5;
  auVar135._4_4_ = fVar176 * 0.0 + fVar127 * 0.5;
  auVar135._8_4_ = fVar178 * 0.0 + fVar128 * 0.5;
  auVar135._12_4_ = fVar180 * 0.0 + fVar129 * 0.5;
  auVar157._0_4_ = fVar182 * 0.5;
  auVar157._4_4_ = fVar201 * 0.5;
  auVar157._8_4_ = fVar204 * 0.5;
  auVar157._12_4_ = fVar206 * 0.5;
  auVar115 = vsubps_avx(auVar135,auVar157);
  auVar136._0_4_ = fVar150 * 0.0 + auVar115._0_4_;
  auVar136._4_4_ = fVar286 * 0.0 + auVar115._4_4_;
  auVar136._8_4_ = fVar287 * 0.0 + auVar115._8_4_;
  auVar136._12_4_ = fVar301 * 0.0 + auVar115._12_4_;
  auVar115 = vshufps_avx(auVar290,auVar290,0xc9);
  fVar200 = auVar72._0_4_;
  auVar82._0_4_ = fVar200 * auVar115._0_4_;
  fVar203 = auVar72._4_4_;
  auVar82._4_4_ = fVar203 * auVar115._4_4_;
  fVar205 = auVar72._8_4_;
  auVar82._8_4_ = fVar205 * auVar115._8_4_;
  fVar223 = auVar72._12_4_;
  auVar82._12_4_ = fVar223 * auVar115._12_4_;
  auVar115 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar291._0_4_ = auVar290._0_4_ * auVar115._0_4_;
  auVar291._4_4_ = auVar290._4_4_ * auVar115._4_4_;
  auVar291._8_4_ = auVar290._8_4_ * auVar115._8_4_;
  auVar291._12_4_ = auVar290._12_4_ * auVar115._12_4_;
  auVar220 = vsubps_avx(auVar291,auVar82);
  auVar83._0_4_ = auVar115._0_4_ * auVar293._0_4_;
  auVar83._4_4_ = auVar115._4_4_ * auVar293._4_4_;
  auVar83._8_4_ = auVar115._8_4_ * auVar293._8_4_;
  auVar83._12_4_ = auVar115._12_4_ * auVar293._12_4_;
  auVar115 = vshufps_avx(auVar293,auVar293,0xc9);
  auVar158._0_4_ = fVar200 * auVar115._0_4_;
  auVar158._4_4_ = fVar203 * auVar115._4_4_;
  auVar158._8_4_ = fVar205 * auVar115._8_4_;
  auVar158._12_4_ = fVar223 * auVar115._12_4_;
  auVar261 = vsubps_avx(auVar83,auVar158);
  auVar115 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar84._0_4_ = auVar303._0_4_ * auVar115._0_4_;
  auVar84._4_4_ = auVar303._4_4_ * auVar115._4_4_;
  auVar84._8_4_ = auVar303._8_4_ * auVar115._8_4_;
  auVar84._12_4_ = auVar303._12_4_ * auVar115._12_4_;
  auVar115 = vshufps_avx(auVar303,auVar303,0xc9);
  auVar105._0_4_ = auVar115._0_4_ * auVar104._0_4_;
  auVar105._4_4_ = auVar115._4_4_ * auVar104._4_4_;
  auVar105._8_4_ = auVar115._8_4_ * auVar104._8_4_;
  auVar105._12_4_ = auVar115._12_4_ * auVar104._12_4_;
  auVar14 = vsubps_avx(auVar105,auVar84);
  auVar220 = vshufps_avx(auVar220,auVar220,0xc9);
  auVar106._0_4_ = auVar115._0_4_ * auVar136._0_4_;
  auVar106._4_4_ = auVar115._4_4_ * auVar136._4_4_;
  auVar106._8_4_ = auVar115._8_4_ * auVar136._8_4_;
  auVar106._12_4_ = auVar115._12_4_ * auVar136._12_4_;
  auVar293 = vshufps_avx(auVar136,auVar136,0xc9);
  auVar115 = vdpps_avx(auVar220,auVar220,0x7f);
  auVar137._0_4_ = auVar303._0_4_ * auVar293._0_4_;
  auVar137._4_4_ = auVar303._4_4_ * auVar293._4_4_;
  auVar137._8_4_ = auVar303._8_4_ * auVar293._8_4_;
  auVar137._12_4_ = auVar303._12_4_ * auVar293._12_4_;
  auVar168 = vsubps_avx(auVar106,auVar137);
  auVar261 = vshufps_avx(auVar261,auVar261,0xc9);
  fVar95 = auVar115._0_4_;
  auVar138 = ZEXT416((uint)fVar95);
  auVar293 = vrsqrtss_avx(auVar138,auVar138);
  fVar71 = auVar293._0_4_;
  auVar293 = vdpps_avx(auVar220,auVar261,0x7f);
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  auVar107._0_4_ = auVar115._0_4_ * auVar261._0_4_;
  auVar107._4_4_ = auVar115._4_4_ * auVar261._4_4_;
  auVar107._8_4_ = auVar115._8_4_ * auVar261._8_4_;
  auVar107._12_4_ = auVar115._12_4_ * auVar261._12_4_;
  auVar115 = vshufps_avx(auVar293,auVar293,0);
  auVar292._0_4_ = auVar115._0_4_ * auVar220._0_4_;
  auVar292._4_4_ = auVar115._4_4_ * auVar220._4_4_;
  auVar292._8_4_ = auVar115._8_4_ * auVar220._8_4_;
  auVar292._12_4_ = auVar115._12_4_ * auVar220._12_4_;
  auVar73 = vsubps_avx(auVar107,auVar292);
  auVar115 = vrcpss_avx(auVar138,auVar138);
  auVar115 = ZEXT416((uint)(auVar115._0_4_ * (2.0 - fVar95 * auVar115._0_4_)));
  auVar261 = vshufps_avx(auVar115,auVar115,0);
  auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar115 = ZEXT416((uint)(fVar71 * 1.5 - fVar95 * 0.5 * fVar71 * fVar71 * fVar71));
  auVar138 = vshufps_avx(auVar115,auVar115,0);
  auVar293 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar71 = auVar220._0_4_ * auVar138._0_4_;
  fVar95 = auVar220._4_4_ * auVar138._4_4_;
  fVar97 = auVar220._8_4_ * auVar138._8_4_;
  fVar151 = auVar220._12_4_ * auVar138._12_4_;
  auVar168 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar115 = vblendps_avx(auVar293,_DAT_01feba10,0xe);
  auVar220 = vrsqrtss_avx(auVar115,auVar115);
  fVar175 = auVar220._0_4_;
  auVar220 = vdpps_avx(auVar14,auVar168,0x7f);
  auVar114 = vshufps_avx(auVar293,auVar293,0);
  auVar139._0_4_ = auVar114._0_4_ * auVar168._0_4_;
  auVar139._4_4_ = auVar114._4_4_ * auVar168._4_4_;
  auVar139._8_4_ = auVar114._8_4_ * auVar168._8_4_;
  auVar139._12_4_ = auVar114._12_4_ * auVar168._12_4_;
  auVar220 = vshufps_avx(auVar220,auVar220,0);
  auVar319._0_4_ = auVar220._0_4_ * auVar14._0_4_;
  auVar319._4_4_ = auVar220._4_4_ * auVar14._4_4_;
  auVar319._8_4_ = auVar220._8_4_ * auVar14._8_4_;
  auVar319._12_4_ = auVar220._12_4_ * auVar14._12_4_;
  auVar168 = vsubps_avx(auVar139,auVar319);
  auVar115 = vrcpss_avx(auVar115,auVar115);
  auVar115 = ZEXT416((uint)(auVar115._0_4_ * (2.0 - auVar293._0_4_ * auVar115._0_4_)));
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  auVar293 = ZEXT416((uint)(fVar175 * 1.5 - auVar293._0_4_ * 0.5 * fVar175 * fVar175 * fVar175));
  auVar293 = vshufps_avx(auVar293,auVar293,0);
  fVar175 = auVar14._0_4_ * auVar293._0_4_;
  fVar177 = auVar14._4_4_ * auVar293._4_4_;
  fVar179 = auVar14._8_4_ * auVar293._8_4_;
  fVar181 = auVar14._12_4_ * auVar293._12_4_;
  auVar220 = vshufps_avx(auVar72,auVar72,0xff);
  auVar14 = vshufps_avx(auVar263,auVar263,0xff);
  auVar85._0_4_ = auVar14._0_4_ * fVar71;
  auVar85._4_4_ = auVar14._4_4_ * fVar95;
  auVar85._8_4_ = auVar14._8_4_ * fVar97;
  auVar85._12_4_ = auVar14._12_4_ * fVar151;
  auVar108._0_4_ =
       auVar220._0_4_ * fVar71 + auVar14._0_4_ * auVar138._0_4_ * auVar73._0_4_ * auVar261._0_4_;
  auVar108._4_4_ =
       auVar220._4_4_ * fVar95 + auVar14._4_4_ * auVar138._4_4_ * auVar73._4_4_ * auVar261._4_4_;
  auVar108._8_4_ =
       auVar220._8_4_ * fVar97 + auVar14._8_4_ * auVar138._8_4_ * auVar73._8_4_ * auVar261._8_4_;
  auVar108._12_4_ =
       auVar220._12_4_ * fVar151 +
       auVar14._12_4_ * auVar138._12_4_ * auVar73._12_4_ * auVar261._12_4_;
  auVar14 = vsubps_avx(auVar263,auVar85);
  auVar138 = vsubps_avx(auVar72,auVar108);
  auVar220 = vshufps_avx(auVar303,auVar303,0xff);
  auVar261 = vshufps_avx(_local_528,_local_528,0xff);
  auVar228._0_4_ = auVar261._0_4_ * fVar175;
  auVar228._4_4_ = auVar261._4_4_ * fVar177;
  auVar228._8_4_ = auVar261._8_4_ * fVar179;
  auVar228._12_4_ = auVar261._12_4_ * fVar181;
  auVar109._0_4_ =
       auVar220._0_4_ * fVar175 + auVar261._0_4_ * auVar293._0_4_ * auVar168._0_4_ * auVar115._0_4_;
  auVar109._4_4_ =
       auVar220._4_4_ * fVar177 + auVar261._4_4_ * auVar293._4_4_ * auVar168._4_4_ * auVar115._4_4_;
  auVar109._8_4_ =
       auVar220._8_4_ * fVar179 + auVar261._8_4_ * auVar293._8_4_ * auVar168._8_4_ * auVar115._8_4_;
  auVar109._12_4_ =
       auVar220._12_4_ * fVar181 +
       auVar261._12_4_ * auVar293._12_4_ * auVar168._12_4_ * auVar115._12_4_;
  auVar220 = vsubps_avx(_local_528,auVar228);
  auVar333._0_4_ = (float)local_528._0_4_ + auVar228._0_4_;
  auVar333._4_4_ = (float)local_528._4_4_ + auVar228._4_4_;
  auVar333._8_4_ = fStack_520 + auVar228._8_4_;
  auVar333._12_4_ = fStack_51c + auVar228._12_4_;
  auVar261 = vsubps_avx(auVar303,auVar109);
  local_458 = auVar167._0_4_;
  fStack_454 = auVar167._4_4_;
  fStack_450 = auVar167._8_4_;
  fStack_44c = auVar167._12_4_;
  local_568 = auVar88._0_4_;
  fStack_564 = auVar88._4_4_;
  fStack_560 = auVar88._8_4_;
  fStack_55c = auVar88._12_4_;
  auVar115 = vshufps_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),0);
  auVar293 = vshufps_avx(ZEXT416((uint)(1.0 - fVar98)),ZEXT416((uint)(1.0 - fVar98)),0);
  fVar151 = auVar115._0_4_;
  fVar175 = auVar115._4_4_;
  fVar177 = auVar115._8_4_;
  fVar179 = auVar115._12_4_;
  fVar98 = auVar293._0_4_;
  fVar71 = auVar293._4_4_;
  fVar95 = auVar293._8_4_;
  fVar97 = auVar293._12_4_;
  local_3a8._0_4_ = fVar98 * local_568 + fVar151 * auVar14._0_4_;
  local_3a8._4_4_ = fVar71 * fStack_564 + fVar175 * auVar14._4_4_;
  fStack_3a0 = fVar95 * fStack_560 + fVar177 * auVar14._8_4_;
  fStack_39c = fVar97 * fStack_55c + fVar179 * auVar14._12_4_;
  fVar208 = fVar98 * (local_568 + local_458 * 0.33333334) +
            fVar151 * (auVar14._0_4_ + auVar138._0_4_ * 0.33333334);
  fVar224 = fVar71 * (fStack_564 + fStack_454 * 0.33333334) +
            fVar175 * (auVar14._4_4_ + auVar138._4_4_ * 0.33333334);
  fVar176 = fVar95 * (fStack_560 + fStack_450 * 0.33333334) +
            fVar177 * (auVar14._8_4_ + auVar138._8_4_ * 0.33333334);
  fVar182 = fVar97 * (fStack_55c + fStack_44c * 0.33333334) +
            fVar179 * (auVar14._12_4_ + auVar138._12_4_ * 0.33333334);
  local_508 = auVar15._0_4_;
  fStack_504 = auVar15._4_4_;
  fStack_500 = auVar15._8_4_;
  fStack_4fc = auVar15._12_4_;
  auVar159._0_4_ = local_508 * 0.33333334;
  auVar159._4_4_ = fStack_504 * 0.33333334;
  auVar159._8_4_ = fStack_500 * 0.33333334;
  auVar159._12_4_ = fStack_4fc * 0.33333334;
  auVar115 = vsubps_avx(auVar142,auVar159);
  auVar229._0_4_ = (auVar274._0_4_ + auVar80._0_4_) * 0.33333334;
  auVar229._4_4_ = (auVar274._4_4_ + auVar80._4_4_) * 0.33333334;
  auVar229._8_4_ = (auVar274._8_4_ + auVar80._8_4_) * 0.33333334;
  auVar229._12_4_ = (auVar274._12_4_ + auVar80._12_4_) * 0.33333334;
  auVar293 = vsubps_avx(_local_5a8,auVar229);
  auVar140._0_4_ = auVar261._0_4_ * 0.33333334;
  auVar140._4_4_ = auVar261._4_4_ * 0.33333334;
  auVar140._8_4_ = auVar261._8_4_ * 0.33333334;
  auVar140._12_4_ = auVar261._12_4_ * 0.33333334;
  auVar261 = vsubps_avx(auVar220,auVar140);
  auVar294._0_4_ = (auVar303._0_4_ + auVar109._0_4_) * 0.33333334;
  auVar294._4_4_ = (auVar303._4_4_ + auVar109._4_4_) * 0.33333334;
  auVar294._8_4_ = (auVar303._8_4_ + auVar109._8_4_) * 0.33333334;
  auVar294._12_4_ = (auVar303._12_4_ + auVar109._12_4_) * 0.33333334;
  auVar14 = vsubps_avx(auVar333,auVar294);
  local_3b8._0_4_ = fVar98 * auVar115._0_4_ + fVar151 * auVar261._0_4_;
  local_3b8._4_4_ = fVar71 * auVar115._4_4_ + fVar175 * auVar261._4_4_;
  fStack_3b0 = fVar95 * auVar115._8_4_ + fVar177 * auVar261._8_4_;
  fStack_3ac = fVar97 * auVar115._12_4_ + fVar179 * auVar261._12_4_;
  fVar222 = fVar151 * auVar220._0_4_ + fVar98 * auVar142._0_4_;
  fVar96 = fVar175 * auVar220._4_4_ + fVar71 * auVar142._4_4_;
  fVar178 = fVar177 * auVar220._8_4_ + fVar95 * auVar142._8_4_;
  fVar201 = fVar179 * auVar220._12_4_ + fVar97 * auVar142._12_4_;
  local_3c8._0_4_ = (float)local_5e8._0_4_ * fVar98 + fVar151 * (auVar263._0_4_ + auVar85._0_4_);
  local_3c8._4_4_ = (float)local_5e8._4_4_ * fVar71 + fVar175 * (auVar263._4_4_ + auVar85._4_4_);
  fStack_3c0 = fStack_5e0 * fVar95 + fVar177 * (auVar263._8_4_ + auVar85._8_4_);
  fStack_3bc = fStack_5dc * fVar97 + fVar179 * (auVar263._12_4_ + auVar85._12_4_);
  local_3d8._0_4_ =
       fVar98 * ((float)local_5e8._0_4_ + (fVar309 + auVar245._0_4_) * 0.33333334) +
       fVar151 * (auVar263._0_4_ + auVar85._0_4_ + (fVar200 + auVar108._0_4_) * 0.33333334);
  local_3d8._4_4_ =
       fVar71 * ((float)local_5e8._4_4_ + (fVar202 + auVar245._4_4_) * 0.33333334) +
       fVar175 * (auVar263._4_4_ + auVar85._4_4_ + (fVar203 + auVar108._4_4_) * 0.33333334);
  fStack_3d0 = fVar95 * (fStack_5e0 + (fVar310 + auVar245._8_4_) * 0.33333334) +
               fVar177 * (auVar263._8_4_ + auVar85._8_4_ + (fVar205 + auVar108._8_4_) * 0.33333334);
  fStack_3cc = fVar97 * (fStack_5dc + (fVar207 + auVar245._12_4_) * 0.33333334) +
               fVar179 * (auVar263._12_4_ + auVar85._12_4_ +
                         (fVar223 + auVar108._12_4_) * 0.33333334);
  fVar223 = fVar98 * auVar293._0_4_ + fVar151 * auVar14._0_4_;
  fVar152 = fVar71 * auVar293._4_4_ + fVar175 * auVar14._4_4_;
  fVar180 = fVar95 * auVar293._8_4_ + fVar177 * auVar14._8_4_;
  fVar204 = fVar97 * auVar293._12_4_ + fVar179 * auVar14._12_4_;
  auVar115 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar115 = vinsertps_avx(auVar115,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_2f8._0_4_ = (float)local_5a8._0_4_ * fVar98 + fVar151 * auVar333._0_4_;
  local_2f8._4_4_ = (float)local_5a8._4_4_ * fVar71 + fVar175 * auVar333._4_4_;
  fStack_2f0 = fStack_5a0 * fVar95 + fVar177 * auVar333._8_4_;
  fStack_2ec = fStack_59c * fVar97 + fVar179 * auVar333._12_4_;
  local_268 = vsubps_avx(_local_3a8,auVar115);
  auVar220 = vmovsldup_avx(local_268);
  auVar293 = vmovshdup_avx(local_268);
  auVar261 = vshufps_avx(local_268,local_268,0xaa);
  fVar98 = pre->ray_space[k].vx.field_0.m128[0];
  fVar71 = pre->ray_space[k].vx.field_0.m128[1];
  fVar95 = pre->ray_space[k].vx.field_0.m128[2];
  fVar97 = pre->ray_space[k].vx.field_0.m128[3];
  fVar151 = pre->ray_space[k].vy.field_0.m128[0];
  fVar175 = pre->ray_space[k].vy.field_0.m128[1];
  fVar177 = pre->ray_space[k].vy.field_0.m128[2];
  fVar179 = pre->ray_space[k].vy.field_0.m128[3];
  fVar181 = pre->ray_space[k].vz.field_0.m128[0];
  fVar200 = pre->ray_space[k].vz.field_0.m128[1];
  fVar203 = pre->ray_space[k].vz.field_0.m128[2];
  fVar205 = pre->ray_space[k].vz.field_0.m128[3];
  local_4e8._0_4_ = fVar98 * auVar220._0_4_ + fVar151 * auVar293._0_4_ + fVar181 * auVar261._0_4_;
  local_4e8._4_4_ = fVar71 * auVar220._4_4_ + fVar175 * auVar293._4_4_ + fVar200 * auVar261._4_4_;
  fStack_4e0 = fVar95 * auVar220._8_4_ + fVar177 * auVar293._8_4_ + fVar203 * auVar261._8_4_;
  fStack_4dc = fVar97 * auVar220._12_4_ + fVar179 * auVar293._12_4_ + fVar205 * auVar261._12_4_;
  auVar59._4_4_ = fVar224;
  auVar59._0_4_ = fVar208;
  auVar59._8_4_ = fVar176;
  auVar59._12_4_ = fVar182;
  local_278 = vsubps_avx(auVar59,auVar115);
  auVar261 = vshufps_avx(local_278,local_278,0xaa);
  auVar293 = vmovshdup_avx(local_278);
  auVar220 = vmovsldup_avx(local_278);
  auVar334._0_8_ =
       CONCAT44(fVar71 * auVar220._4_4_ + fVar175 * auVar293._4_4_ + fVar200 * auVar261._4_4_,
                fVar98 * auVar220._0_4_ + fVar151 * auVar293._0_4_ + fVar181 * auVar261._0_4_);
  auVar334._8_4_ = fVar95 * auVar220._8_4_ + fVar177 * auVar293._8_4_ + fVar203 * auVar261._8_4_;
  auVar334._12_4_ = fVar97 * auVar220._12_4_ + fVar179 * auVar293._12_4_ + fVar205 * auVar261._12_4_
  ;
  local_288 = vsubps_avx(_local_3b8,auVar115);
  auVar261 = vshufps_avx(local_288,local_288,0xaa);
  auVar293 = vmovshdup_avx(local_288);
  auVar220 = vmovsldup_avx(local_288);
  auVar343._0_4_ = fVar98 * auVar220._0_4_ + fVar151 * auVar293._0_4_ + fVar181 * auVar261._0_4_;
  auVar343._4_4_ = fVar71 * auVar220._4_4_ + fVar175 * auVar293._4_4_ + fVar200 * auVar261._4_4_;
  auVar343._8_4_ = fVar95 * auVar220._8_4_ + fVar177 * auVar293._8_4_ + fVar203 * auVar261._8_4_;
  auVar343._12_4_ = fVar97 * auVar220._12_4_ + fVar179 * auVar293._12_4_ + fVar205 * auVar261._12_4_
  ;
  auVar57._4_4_ = fVar96;
  auVar57._0_4_ = fVar222;
  auVar57._8_4_ = fVar178;
  auVar57._12_4_ = fVar201;
  local_298 = vsubps_avx(auVar57,auVar115);
  auVar261 = vshufps_avx(local_298,local_298,0xaa);
  auVar293 = vmovshdup_avx(local_298);
  auVar220 = vmovsldup_avx(local_298);
  auVar246._0_4_ = auVar220._0_4_ * fVar98 + auVar293._0_4_ * fVar151 + fVar181 * auVar261._0_4_;
  auVar246._4_4_ = auVar220._4_4_ * fVar71 + auVar293._4_4_ * fVar175 + fVar200 * auVar261._4_4_;
  auVar246._8_4_ = auVar220._8_4_ * fVar95 + auVar293._8_4_ * fVar177 + fVar203 * auVar261._8_4_;
  auVar246._12_4_ = auVar220._12_4_ * fVar97 + auVar293._12_4_ * fVar179 + fVar205 * auVar261._12_4_
  ;
  local_2a8 = vsubps_avx(_local_3c8,auVar115);
  auVar261 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar293 = vmovshdup_avx(local_2a8);
  auVar220 = vmovsldup_avx(local_2a8);
  auVar264._0_4_ = auVar220._0_4_ * fVar98 + auVar293._0_4_ * fVar151 + auVar261._0_4_ * fVar181;
  auVar264._4_4_ = auVar220._4_4_ * fVar71 + auVar293._4_4_ * fVar175 + auVar261._4_4_ * fVar200;
  auVar264._8_4_ = auVar220._8_4_ * fVar95 + auVar293._8_4_ * fVar177 + auVar261._8_4_ * fVar203;
  auVar264._12_4_ = auVar220._12_4_ * fVar97 + auVar293._12_4_ * fVar179 + auVar261._12_4_ * fVar205
  ;
  local_2b8 = vsubps_avx(_local_3d8,auVar115);
  auVar261 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar293 = vmovshdup_avx(local_2b8);
  auVar220 = vmovsldup_avx(local_2b8);
  auVar275._0_4_ = auVar220._0_4_ * fVar98 + auVar293._0_4_ * fVar151 + auVar261._0_4_ * fVar181;
  auVar275._4_4_ = auVar220._4_4_ * fVar71 + auVar293._4_4_ * fVar175 + auVar261._4_4_ * fVar200;
  auVar275._8_4_ = auVar220._8_4_ * fVar95 + auVar293._8_4_ * fVar177 + auVar261._8_4_ * fVar203;
  auVar275._12_4_ = auVar220._12_4_ * fVar97 + auVar293._12_4_ * fVar179 + auVar261._12_4_ * fVar205
  ;
  auVar55._4_4_ = fVar152;
  auVar55._0_4_ = fVar223;
  auVar55._8_4_ = fVar180;
  auVar55._12_4_ = fVar204;
  local_2c8 = vsubps_avx(auVar55,auVar115);
  auVar261 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar293 = vmovshdup_avx(local_2c8);
  auVar220 = vmovsldup_avx(local_2c8);
  auVar295._0_4_ = auVar220._0_4_ * fVar98 + auVar293._0_4_ * fVar151 + auVar261._0_4_ * fVar181;
  auVar295._4_4_ = auVar220._4_4_ * fVar71 + auVar293._4_4_ * fVar175 + auVar261._4_4_ * fVar200;
  auVar295._8_4_ = auVar220._8_4_ * fVar95 + auVar293._8_4_ * fVar177 + auVar261._8_4_ * fVar203;
  auVar295._12_4_ = auVar220._12_4_ * fVar97 + auVar293._12_4_ * fVar179 + auVar261._12_4_ * fVar205
  ;
  local_2d8 = vsubps_avx(_local_2f8,auVar115);
  auVar220 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar115 = vmovshdup_avx(local_2d8);
  auVar293 = vmovsldup_avx(local_2d8);
  auVar86._0_4_ = fVar98 * auVar293._0_4_ + fVar151 * auVar115._0_4_ + fVar181 * auVar220._0_4_;
  auVar86._4_4_ = fVar71 * auVar293._4_4_ + fVar175 * auVar115._4_4_ + fVar200 * auVar220._4_4_;
  auVar86._8_4_ = fVar95 * auVar293._8_4_ + fVar177 * auVar115._8_4_ + fVar203 * auVar220._8_4_;
  auVar86._12_4_ = fVar97 * auVar293._12_4_ + fVar179 * auVar115._12_4_ + fVar205 * auVar220._12_4_;
  auVar261 = vmovlhps_avx(_local_4e8,auVar264);
  auVar14 = vmovlhps_avx(auVar334,auVar275);
  auVar138 = vmovlhps_avx(auVar343,auVar295);
  _local_398 = vmovlhps_avx(auVar246,auVar86);
  auVar115 = vminps_avx(auVar261,auVar14);
  auVar293 = vminps_avx(auVar138,_local_398);
  auVar220 = vminps_avx(auVar115,auVar293);
  auVar115 = vmaxps_avx(auVar261,auVar14);
  auVar293 = vmaxps_avx(auVar138,_local_398);
  auVar115 = vmaxps_avx(auVar115,auVar293);
  auVar293 = vshufpd_avx(auVar220,auVar220,3);
  auVar220 = vminps_avx(auVar220,auVar293);
  auVar293 = vshufpd_avx(auVar115,auVar115,3);
  auVar293 = vmaxps_avx(auVar115,auVar293);
  auVar230._8_4_ = 0x7fffffff;
  auVar230._0_8_ = 0x7fffffff7fffffff;
  auVar230._12_4_ = 0x7fffffff;
  auVar115 = vandps_avx(auVar220,auVar230);
  auVar293 = vandps_avx(auVar293,auVar230);
  auVar115 = vmaxps_avx(auVar115,auVar293);
  auVar293 = vmovshdup_avx(auVar115);
  auVar115 = vmaxss_avx(auVar293,auVar115);
  local_410 = (ulong)uVar63 + 0xf;
  fVar71 = auVar115._0_4_ * 9.536743e-07;
  register0x00001548 = auVar334._0_8_;
  local_388 = auVar334._0_8_;
  auVar115 = vshufps_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),0);
  local_138._16_16_ = auVar115;
  local_138._0_16_ = auVar115;
  auVar87._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
  auVar87._8_4_ = auVar115._8_4_ ^ 0x80000000;
  auVar87._12_4_ = auVar115._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar87;
  local_158._0_16_ = auVar87;
  local_358 = vpshufd_avx(ZEXT416(uVar65),0);
  local_368 = vpshufd_avx(ZEXT416(*(uint *)(local_420 + lVar67 * 4 + 6)),0);
  uVar70 = 0;
  fVar98 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar14,auVar261);
  _local_248 = vsubps_avx(auVar138,auVar14);
  _local_258 = vsubps_avx(_local_398,auVar138);
  _local_308 = vsubps_avx(_local_3c8,_local_3a8);
  auVar60._4_4_ = fVar224;
  auVar60._0_4_ = fVar208;
  auVar60._8_4_ = fVar176;
  auVar60._12_4_ = fVar182;
  _local_318 = vsubps_avx(_local_3d8,auVar60);
  auVar56._4_4_ = fVar152;
  auVar56._0_4_ = fVar223;
  auVar56._8_4_ = fVar180;
  auVar56._12_4_ = fVar204;
  _local_328 = vsubps_avx(auVar56,_local_3b8);
  auVar58._4_4_ = fVar96;
  auVar58._0_4_ = fVar222;
  auVar58._8_4_ = fVar178;
  auVar58._12_4_ = fVar201;
  _local_338 = vsubps_avx(_local_2f8,auVar58);
  _local_5e8 = ZEXT816(0x3f80000000000000);
  local_2e8 = _local_5e8;
  do {
    auVar115 = vshufps_avx(_local_5e8,_local_5e8,0x50);
    auVar351._8_4_ = 0x3f800000;
    auVar351._0_8_ = &DAT_3f8000003f800000;
    auVar351._12_4_ = 0x3f800000;
    auVar354._16_4_ = 0x3f800000;
    auVar354._0_16_ = auVar351;
    auVar354._20_4_ = 0x3f800000;
    auVar354._24_4_ = 0x3f800000;
    auVar354._28_4_ = 0x3f800000;
    auVar293 = vsubps_avx(auVar351,auVar115);
    fVar95 = auVar115._0_4_;
    fVar97 = auVar115._4_4_;
    fVar151 = auVar115._8_4_;
    fVar175 = auVar115._12_4_;
    fVar177 = auVar293._0_4_;
    fVar179 = auVar293._4_4_;
    fVar181 = auVar293._8_4_;
    fVar200 = auVar293._12_4_;
    auVar141._0_4_ = auVar264._0_4_ * fVar95 + fVar177 * (float)local_4e8._0_4_;
    auVar141._4_4_ = auVar264._4_4_ * fVar97 + fVar179 * (float)local_4e8._4_4_;
    auVar141._8_4_ = auVar264._0_4_ * fVar151 + fVar181 * (float)local_4e8._0_4_;
    auVar141._12_4_ = auVar264._4_4_ * fVar175 + fVar200 * (float)local_4e8._4_4_;
    auVar110._0_4_ = auVar275._0_4_ * fVar95 + local_388._0_4_ * fVar177;
    auVar110._4_4_ = auVar275._4_4_ * fVar97 + local_388._4_4_ * fVar179;
    auVar110._8_4_ = auVar275._0_4_ * fVar151 + local_388._8_4_ * fVar181;
    auVar110._12_4_ = auVar275._4_4_ * fVar175 + local_388._12_4_ * fVar200;
    auVar247._0_4_ = auVar295._0_4_ * fVar95 + auVar343._0_4_ * fVar177;
    auVar247._4_4_ = auVar295._4_4_ * fVar97 + auVar343._4_4_ * fVar179;
    auVar247._8_4_ = auVar295._0_4_ * fVar151 + auVar343._0_4_ * fVar181;
    auVar247._12_4_ = auVar295._4_4_ * fVar175 + auVar343._4_4_ * fVar200;
    auVar160._0_4_ = auVar86._0_4_ * fVar95 + auVar246._0_4_ * fVar177;
    auVar160._4_4_ = auVar86._4_4_ * fVar97 + auVar246._4_4_ * fVar179;
    auVar160._8_4_ = auVar86._0_4_ * fVar151 + auVar246._0_4_ * fVar181;
    auVar160._12_4_ = auVar86._4_4_ * fVar175 + auVar246._4_4_ * fVar200;
    auVar115 = vmovshdup_avx(local_2e8);
    auVar293 = vshufps_avx(local_2e8,local_2e8,0);
    auVar271._16_16_ = auVar293;
    auVar271._0_16_ = auVar293;
    auVar220 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar92._16_16_ = auVar220;
    auVar92._0_16_ = auVar220;
    auVar91 = vsubps_avx(auVar92,auVar271);
    auVar220 = vshufps_avx(auVar141,auVar141,0);
    auVar168 = vshufps_avx(auVar141,auVar141,0x55);
    auVar114 = vshufps_avx(auVar110,auVar110,0);
    auVar167 = vshufps_avx(auVar110,auVar110,0x55);
    auVar88 = vshufps_avx(auVar247,auVar247,0);
    auVar142 = vshufps_avx(auVar247,auVar247,0x55);
    auVar15 = vshufps_avx(auVar160,auVar160,0);
    auVar72 = vshufps_avx(auVar160,auVar160,0x55);
    auVar115 = ZEXT416((uint)((auVar115._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar115 = vshufps_avx(auVar115,auVar115,0);
    auVar285._0_4_ = auVar293._0_4_ + auVar91._0_4_ * 0.0;
    auVar285._4_4_ = auVar293._4_4_ + auVar91._4_4_ * 0.14285715;
    auVar285._8_4_ = auVar293._8_4_ + auVar91._8_4_ * 0.2857143;
    auVar285._12_4_ = auVar293._12_4_ + auVar91._12_4_ * 0.42857146;
    auVar285._16_4_ = auVar293._0_4_ + auVar91._16_4_ * 0.5714286;
    auVar285._20_4_ = auVar293._4_4_ + auVar91._20_4_ * 0.71428573;
    auVar285._24_4_ = auVar293._8_4_ + auVar91._24_4_ * 0.8571429;
    auVar285._28_4_ = auVar293._12_4_ + auVar91._28_4_;
    auVar18 = vsubps_avx(auVar354,auVar285);
    fVar287 = auVar114._0_4_;
    fVar99 = auVar114._4_4_;
    fVar202 = auVar114._8_4_;
    fVar207 = auVar114._12_4_;
    fVar95 = auVar18._0_4_;
    fVar177 = auVar18._4_4_;
    fVar203 = auVar18._8_4_;
    fVar286 = auVar18._12_4_;
    fVar339 = auVar220._12_4_;
    fVar127 = auVar18._16_4_;
    fVar128 = auVar18._20_4_;
    fVar129 = auVar18._24_4_;
    fVar237 = auVar167._0_4_;
    fVar238 = auVar167._4_4_;
    fVar239 = auVar167._8_4_;
    fVar331 = auVar167._12_4_;
    local_588 = auVar168._0_4_;
    fStack_584 = auVar168._4_4_;
    fStack_580 = auVar168._8_4_;
    fStack_57c = auVar168._12_4_;
    fVar97 = auVar88._0_4_;
    fVar175 = auVar88._4_4_;
    fVar181 = auVar88._8_4_;
    fVar205 = auVar88._12_4_;
    fVar301 = auVar285._0_4_ * fVar97 + fVar287 * fVar95;
    fVar309 = auVar285._4_4_ * fVar175 + fVar99 * fVar177;
    fVar310 = auVar285._8_4_ * fVar181 + fVar202 * fVar203;
    fVar311 = auVar285._12_4_ * fVar205 + fVar207 * fVar286;
    fVar312 = auVar285._16_4_ * fVar97 + fVar287 * fVar127;
    fVar313 = auVar285._20_4_ * fVar175 + fVar99 * fVar128;
    fVar314 = auVar285._24_4_ * fVar181 + fVar202 * fVar129;
    fVar151 = auVar142._0_4_;
    fVar179 = auVar142._4_4_;
    fVar200 = auVar142._8_4_;
    fVar206 = auVar142._12_4_;
    fVar315 = auVar285._0_4_ * fVar151 + fVar237 * fVar95;
    fVar322 = auVar285._4_4_ * fVar179 + fVar238 * fVar177;
    fVar323 = auVar285._8_4_ * fVar200 + fVar239 * fVar203;
    fVar324 = auVar285._12_4_ * fVar206 + fVar331 * fVar286;
    fVar325 = auVar285._16_4_ * fVar151 + fVar237 * fVar127;
    fVar327 = auVar285._20_4_ * fVar179 + fVar238 * fVar128;
    fVar329 = auVar285._24_4_ * fVar200 + fVar239 * fVar129;
    auVar293 = vshufps_avx(auVar141,auVar141,0xaa);
    auVar168 = vshufps_avx(auVar141,auVar141,0xff);
    fVar150 = fVar205 + 0.0;
    auVar114 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar167 = vshufps_avx(auVar110,auVar110,0xff);
    auVar93._0_4_ =
         fVar95 * (fVar287 * auVar285._0_4_ + auVar220._0_4_ * fVar95) + auVar285._0_4_ * fVar301;
    auVar93._4_4_ =
         fVar177 * (fVar99 * auVar285._4_4_ + auVar220._4_4_ * fVar177) + auVar285._4_4_ * fVar309;
    auVar93._8_4_ =
         fVar203 * (fVar202 * auVar285._8_4_ + auVar220._8_4_ * fVar203) + auVar285._8_4_ * fVar310;
    auVar93._12_4_ =
         fVar286 * (fVar207 * auVar285._12_4_ + fVar339 * fVar286) + auVar285._12_4_ * fVar311;
    auVar93._16_4_ =
         fVar127 * (fVar287 * auVar285._16_4_ + auVar220._0_4_ * fVar127) +
         auVar285._16_4_ * fVar312;
    auVar93._20_4_ =
         fVar128 * (fVar99 * auVar285._20_4_ + auVar220._4_4_ * fVar128) + auVar285._20_4_ * fVar313
    ;
    auVar93._24_4_ =
         fVar129 * (fVar202 * auVar285._24_4_ + auVar220._8_4_ * fVar129) +
         auVar285._24_4_ * fVar314;
    auVar93._28_4_ = fVar339 + 1.0 + fVar206;
    auVar171._0_4_ =
         fVar95 * (fVar237 * auVar285._0_4_ + fVar95 * local_588) + auVar285._0_4_ * fVar315;
    auVar171._4_4_ =
         fVar177 * (fVar238 * auVar285._4_4_ + fVar177 * fStack_584) + auVar285._4_4_ * fVar322;
    auVar171._8_4_ =
         fVar203 * (fVar239 * auVar285._8_4_ + fVar203 * fStack_580) + auVar285._8_4_ * fVar323;
    auVar171._12_4_ =
         fVar286 * (fVar331 * auVar285._12_4_ + fVar286 * fStack_57c) + auVar285._12_4_ * fVar324;
    auVar171._16_4_ =
         fVar127 * (fVar237 * auVar285._16_4_ + fVar127 * local_588) + auVar285._16_4_ * fVar325;
    auVar171._20_4_ =
         fVar128 * (fVar238 * auVar285._20_4_ + fVar128 * fStack_584) + auVar285._20_4_ * fVar327;
    auVar171._24_4_ =
         fVar129 * (fVar239 * auVar285._24_4_ + fVar129 * fStack_580) + auVar285._24_4_ * fVar329;
    auVar171._28_4_ = fVar339 + 1.0 + fVar206;
    auVar197._0_4_ =
         fVar95 * fVar301 + auVar285._0_4_ * (auVar15._0_4_ * auVar285._0_4_ + fVar95 * fVar97);
    auVar197._4_4_ =
         fVar177 * fVar309 + auVar285._4_4_ * (auVar15._4_4_ * auVar285._4_4_ + fVar177 * fVar175);
    auVar197._8_4_ =
         fVar203 * fVar310 + auVar285._8_4_ * (auVar15._8_4_ * auVar285._8_4_ + fVar203 * fVar181);
    auVar197._12_4_ =
         fVar286 * fVar311 +
         auVar285._12_4_ * (auVar15._12_4_ * auVar285._12_4_ + fVar286 * fVar205);
    auVar197._16_4_ =
         fVar127 * fVar312 + auVar285._16_4_ * (auVar15._0_4_ * auVar285._16_4_ + fVar127 * fVar97);
    auVar197._20_4_ =
         fVar128 * fVar313 + auVar285._20_4_ * (auVar15._4_4_ * auVar285._20_4_ + fVar128 * fVar175)
    ;
    auVar197._24_4_ =
         fVar129 * fVar314 + auVar285._24_4_ * (auVar15._8_4_ * auVar285._24_4_ + fVar129 * fVar181)
    ;
    auVar197._28_4_ = fVar206 + fVar150;
    auVar300._0_4_ =
         fVar95 * fVar315 + auVar285._0_4_ * (auVar72._0_4_ * auVar285._0_4_ + fVar95 * fVar151);
    auVar300._4_4_ =
         fVar177 * fVar322 + auVar285._4_4_ * (auVar72._4_4_ * auVar285._4_4_ + fVar177 * fVar179);
    auVar300._8_4_ =
         fVar203 * fVar323 + auVar285._8_4_ * (auVar72._8_4_ * auVar285._8_4_ + fVar203 * fVar200);
    auVar300._12_4_ =
         fVar286 * fVar324 +
         auVar285._12_4_ * (auVar72._12_4_ * auVar285._12_4_ + fVar286 * fVar206);
    auVar300._16_4_ =
         fVar127 * fVar325 + auVar285._16_4_ * (auVar72._0_4_ * auVar285._16_4_ + fVar127 * fVar151)
    ;
    auVar300._20_4_ =
         fVar128 * fVar327 + auVar285._20_4_ * (auVar72._4_4_ * auVar285._20_4_ + fVar128 * fVar179)
    ;
    auVar300._24_4_ =
         fVar129 * fVar329 + auVar285._24_4_ * (auVar72._8_4_ * auVar285._24_4_ + fVar129 * fVar200)
    ;
    auVar300._28_4_ = fVar150 + fVar206 + 0.0;
    local_78._0_4_ = fVar95 * auVar93._0_4_ + auVar285._0_4_ * auVar197._0_4_;
    local_78._4_4_ = fVar177 * auVar93._4_4_ + auVar285._4_4_ * auVar197._4_4_;
    local_78._8_4_ = fVar203 * auVar93._8_4_ + auVar285._8_4_ * auVar197._8_4_;
    local_78._12_4_ = fVar286 * auVar93._12_4_ + auVar285._12_4_ * auVar197._12_4_;
    local_78._16_4_ = fVar127 * auVar93._16_4_ + auVar285._16_4_ * auVar197._16_4_;
    local_78._20_4_ = fVar128 * auVar93._20_4_ + auVar285._20_4_ * auVar197._20_4_;
    local_78._24_4_ = fVar129 * auVar93._24_4_ + auVar285._24_4_ * auVar197._24_4_;
    local_78._28_4_ = fVar339 + fVar207 + fVar206 + 0.0;
    local_98._0_4_ = fVar95 * auVar171._0_4_ + auVar285._0_4_ * auVar300._0_4_;
    local_98._4_4_ = fVar177 * auVar171._4_4_ + auVar285._4_4_ * auVar300._4_4_;
    local_98._8_4_ = fVar203 * auVar171._8_4_ + auVar285._8_4_ * auVar300._8_4_;
    local_98._12_4_ = fVar286 * auVar171._12_4_ + auVar285._12_4_ * auVar300._12_4_;
    local_98._16_4_ = fVar127 * auVar171._16_4_ + auVar285._16_4_ * auVar300._16_4_;
    local_98._20_4_ = fVar128 * auVar171._20_4_ + auVar285._20_4_ * auVar300._20_4_;
    local_98._24_4_ = fVar129 * auVar171._24_4_ + auVar285._24_4_ * auVar300._24_4_;
    local_98._28_4_ = fVar339 + fVar207 + fVar150;
    auVar19 = vsubps_avx(auVar197,auVar93);
    auVar91 = vsubps_avx(auVar300,auVar171);
    local_528._0_4_ = auVar115._0_4_;
    local_528._4_4_ = auVar115._4_4_;
    fStack_520 = auVar115._8_4_;
    fStack_51c = auVar115._12_4_;
    local_d8 = (float)local_528._0_4_ * auVar19._0_4_ * 3.0;
    fStack_d4 = (float)local_528._4_4_ * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_d4;
    auVar20._0_4_ = local_d8;
    fStack_d0 = fStack_520 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_d0;
    fStack_cc = fStack_51c * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_cc;
    fStack_c8 = (float)local_528._0_4_ * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_c8;
    fStack_c4 = (float)local_528._4_4_ * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_c4;
    fStack_c0 = fStack_520 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_c0;
    auVar20._28_4_ = auVar19._28_4_;
    fVar309 = (float)local_528._0_4_ * auVar91._0_4_ * 3.0;
    fVar202 = (float)local_528._4_4_ * auVar91._4_4_ * 3.0;
    auVar21._4_4_ = fVar202;
    auVar21._0_4_ = fVar309;
    fVar310 = fStack_520 * auVar91._8_4_ * 3.0;
    auVar21._8_4_ = fVar310;
    fVar207 = fStack_51c * auVar91._12_4_ * 3.0;
    auVar21._12_4_ = fVar207;
    fVar311 = (float)local_528._0_4_ * auVar91._16_4_ * 3.0;
    auVar21._16_4_ = fVar311;
    fVar312 = (float)local_528._4_4_ * auVar91._20_4_ * 3.0;
    auVar21._20_4_ = fVar312;
    fVar313 = fStack_520 * auVar91._24_4_ * 3.0;
    auVar21._24_4_ = fVar313;
    auVar21._28_4_ = auVar197._28_4_;
    auVar20 = vsubps_avx(local_78,auVar20);
    auVar91 = vperm2f128_avx(auVar20,auVar20,1);
    auVar91 = vshufps_avx(auVar91,auVar20,0x30);
    auVar91 = vshufps_avx(auVar20,auVar91,0x29);
    auVar21 = vsubps_avx(local_98,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar92 = vshufps_avx(auVar21,auVar20,0x29);
    fVar341 = auVar114._0_4_;
    fVar347 = auVar114._4_4_;
    fVar348 = auVar114._8_4_;
    fVar97 = auVar167._0_4_;
    fVar179 = auVar167._4_4_;
    fVar205 = auVar167._8_4_;
    fVar287 = auVar167._12_4_;
    fVar340 = auVar168._12_4_;
    auVar115 = vshufps_avx(auVar247,auVar247,0xaa);
    fVar151 = auVar115._0_4_;
    fVar181 = auVar115._4_4_;
    fVar206 = auVar115._8_4_;
    fVar301 = auVar115._12_4_;
    fVar324 = auVar285._0_4_ * fVar151 + fVar341 * fVar95;
    fVar325 = auVar285._4_4_ * fVar181 + fVar347 * fVar177;
    fVar327 = auVar285._8_4_ * fVar206 + fVar348 * fVar203;
    fVar329 = auVar285._12_4_ * fVar301 + auVar114._12_4_ * fVar286;
    fVar326 = auVar285._16_4_ * fVar151 + fVar341 * fVar127;
    fVar328 = auVar285._20_4_ * fVar181 + fVar347 * fVar128;
    fVar330 = auVar285._24_4_ * fVar206 + fVar348 * fVar129;
    fVar331 = fVar340 + fVar339 + fVar331;
    auVar115 = vshufps_avx(auVar247,auVar247,0xff);
    fVar175 = auVar115._0_4_;
    fVar200 = auVar115._4_4_;
    fVar150 = auVar115._8_4_;
    fVar99 = auVar115._12_4_;
    fVar314 = auVar285._0_4_ * fVar175 + fVar95 * fVar97;
    fVar237 = auVar285._4_4_ * fVar200 + fVar177 * fVar179;
    fVar315 = auVar285._8_4_ * fVar150 + fVar203 * fVar205;
    fVar238 = auVar285._12_4_ * fVar99 + fVar286 * fVar287;
    fVar322 = auVar285._16_4_ * fVar175 + fVar127 * fVar97;
    fVar239 = auVar285._20_4_ * fVar200 + fVar128 * fVar179;
    fVar323 = auVar285._24_4_ * fVar150 + fVar129 * fVar205;
    auVar115 = vshufps_avx(auVar160,auVar160,0xaa);
    auVar220 = vshufps_avx(auVar160,auVar160,0xff);
    fVar339 = auVar220._12_4_;
    auVar94._0_4_ =
         auVar285._0_4_ * fVar324 + fVar95 * (fVar341 * auVar285._0_4_ + auVar293._0_4_ * fVar95);
    auVar94._4_4_ =
         auVar285._4_4_ * fVar325 + fVar177 * (fVar347 * auVar285._4_4_ + auVar293._4_4_ * fVar177);
    auVar94._8_4_ =
         auVar285._8_4_ * fVar327 + fVar203 * (fVar348 * auVar285._8_4_ + auVar293._8_4_ * fVar203);
    auVar94._12_4_ =
         auVar285._12_4_ * fVar329 +
         fVar286 * (auVar114._12_4_ * auVar285._12_4_ + auVar293._12_4_ * fVar286);
    auVar94._16_4_ =
         auVar285._16_4_ * fVar326 +
         fVar127 * (fVar341 * auVar285._16_4_ + auVar293._0_4_ * fVar127);
    auVar94._20_4_ =
         auVar285._20_4_ * fVar328 +
         fVar128 * (fVar347 * auVar285._20_4_ + auVar293._4_4_ * fVar128);
    auVar94._24_4_ =
         auVar285._24_4_ * fVar330 +
         fVar129 * (fVar348 * auVar285._24_4_ + auVar293._8_4_ * fVar129);
    auVar94._28_4_ = fVar339 + auVar21._28_4_ + auVar20._28_4_;
    auVar338._0_4_ =
         auVar285._0_4_ * fVar314 + fVar95 * (auVar285._0_4_ * fVar97 + auVar168._0_4_ * fVar95);
    auVar338._4_4_ =
         auVar285._4_4_ * fVar237 + fVar177 * (auVar285._4_4_ * fVar179 + auVar168._4_4_ * fVar177);
    auVar338._8_4_ =
         auVar285._8_4_ * fVar315 + fVar203 * (auVar285._8_4_ * fVar205 + auVar168._8_4_ * fVar203);
    auVar338._12_4_ =
         auVar285._12_4_ * fVar238 + fVar286 * (auVar285._12_4_ * fVar287 + fVar340 * fVar286);
    auVar338._16_4_ =
         auVar285._16_4_ * fVar322 + fVar127 * (auVar285._16_4_ * fVar97 + auVar168._0_4_ * fVar127)
    ;
    auVar338._20_4_ =
         auVar285._20_4_ * fVar239 +
         fVar128 * (auVar285._20_4_ * fVar179 + auVar168._4_4_ * fVar128);
    auVar338._24_4_ =
         auVar285._24_4_ * fVar323 +
         fVar129 * (auVar285._24_4_ * fVar205 + auVar168._8_4_ * fVar129);
    auVar338._28_4_ = fVar339 + auVar20._28_4_ + auVar197._28_4_;
    auVar20 = vperm2f128_avx(local_78,local_78,1);
    auVar20 = vshufps_avx(auVar20,local_78,0x30);
    auVar93 = vshufps_avx(local_78,auVar20,0x29);
    auVar198._0_4_ =
         fVar95 * fVar324 + auVar285._0_4_ * (auVar115._0_4_ * auVar285._0_4_ + fVar95 * fVar151);
    auVar198._4_4_ =
         fVar177 * fVar325 + auVar285._4_4_ * (auVar115._4_4_ * auVar285._4_4_ + fVar177 * fVar181);
    auVar198._8_4_ =
         fVar203 * fVar327 + auVar285._8_4_ * (auVar115._8_4_ * auVar285._8_4_ + fVar203 * fVar206);
    auVar198._12_4_ =
         fVar286 * fVar329 +
         auVar285._12_4_ * (auVar115._12_4_ * auVar285._12_4_ + fVar286 * fVar301);
    auVar198._16_4_ =
         fVar127 * fVar326 +
         auVar285._16_4_ * (auVar115._0_4_ * auVar285._16_4_ + fVar127 * fVar151);
    auVar198._20_4_ =
         fVar128 * fVar328 +
         auVar285._20_4_ * (auVar115._4_4_ * auVar285._20_4_ + fVar128 * fVar181);
    auVar198._24_4_ =
         fVar129 * fVar330 +
         auVar285._24_4_ * (auVar115._8_4_ * auVar285._24_4_ + fVar129 * fVar206);
    auVar198._28_4_ = fVar331 + auVar115._12_4_ + fVar301;
    auVar236._0_4_ =
         fVar95 * fVar314 + auVar285._0_4_ * (auVar220._0_4_ * auVar285._0_4_ + fVar95 * fVar175);
    auVar236._4_4_ =
         fVar177 * fVar237 + auVar285._4_4_ * (auVar220._4_4_ * auVar285._4_4_ + fVar177 * fVar200);
    auVar236._8_4_ =
         fVar203 * fVar315 + auVar285._8_4_ * (auVar220._8_4_ * auVar285._8_4_ + fVar203 * fVar150);
    auVar236._12_4_ =
         fVar286 * fVar238 + auVar285._12_4_ * (fVar339 * auVar285._12_4_ + fVar286 * fVar99);
    auVar236._16_4_ =
         fVar127 * fVar322 +
         auVar285._16_4_ * (auVar220._0_4_ * auVar285._16_4_ + fVar127 * fVar175);
    auVar236._20_4_ =
         fVar128 * fVar239 +
         auVar285._20_4_ * (auVar220._4_4_ * auVar285._20_4_ + fVar128 * fVar200);
    auVar236._24_4_ =
         fVar129 * fVar323 +
         auVar285._24_4_ * (auVar220._8_4_ * auVar285._24_4_ + fVar129 * fVar150);
    auVar236._28_4_ = fVar340 + fVar287 + fVar339 + fVar99;
    auVar251._0_4_ = fVar95 * auVar94._0_4_ + auVar285._0_4_ * auVar198._0_4_;
    auVar251._4_4_ = fVar177 * auVar94._4_4_ + auVar285._4_4_ * auVar198._4_4_;
    auVar251._8_4_ = fVar203 * auVar94._8_4_ + auVar285._8_4_ * auVar198._8_4_;
    auVar251._12_4_ = fVar286 * auVar94._12_4_ + auVar285._12_4_ * auVar198._12_4_;
    auVar251._16_4_ = fVar127 * auVar94._16_4_ + auVar285._16_4_ * auVar198._16_4_;
    auVar251._20_4_ = fVar128 * auVar94._20_4_ + auVar285._20_4_ * auVar198._20_4_;
    auVar251._24_4_ = fVar129 * auVar94._24_4_ + auVar285._24_4_ * auVar198._24_4_;
    auVar251._28_4_ = fVar331 + fVar339 + fVar99;
    auVar272._0_4_ = fVar95 * auVar338._0_4_ + auVar285._0_4_ * auVar236._0_4_;
    auVar272._4_4_ = fVar177 * auVar338._4_4_ + auVar285._4_4_ * auVar236._4_4_;
    auVar272._8_4_ = fVar203 * auVar338._8_4_ + auVar285._8_4_ * auVar236._8_4_;
    auVar272._12_4_ = fVar286 * auVar338._12_4_ + auVar285._12_4_ * auVar236._12_4_;
    auVar272._16_4_ = fVar127 * auVar338._16_4_ + auVar285._16_4_ * auVar236._16_4_;
    auVar272._20_4_ = fVar128 * auVar338._20_4_ + auVar285._20_4_ * auVar236._20_4_;
    auVar272._24_4_ = fVar129 * auVar338._24_4_ + auVar285._24_4_ * auVar236._24_4_;
    auVar272._28_4_ = auVar18._28_4_ + auVar285._28_4_;
    auVar20 = vsubps_avx(auVar198,auVar94);
    auVar18 = vsubps_avx(auVar236,auVar338);
    local_f8 = (float)local_528._0_4_ * auVar20._0_4_ * 3.0;
    fStack_f4 = (float)local_528._4_4_ * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_f4;
    auVar16._0_4_ = local_f8;
    fStack_f0 = fStack_520 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_f0;
    fStack_ec = fStack_51c * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_ec;
    fStack_e8 = (float)local_528._0_4_ * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_e8;
    fStack_e4 = (float)local_528._4_4_ * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_e4;
    fStack_e0 = fStack_520 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_e0;
    auVar16._28_4_ = auVar236._28_4_;
    local_118 = (float)local_528._0_4_ * auVar18._0_4_ * 3.0;
    fStack_114 = (float)local_528._4_4_ * auVar18._4_4_ * 3.0;
    auVar17._4_4_ = fStack_114;
    auVar17._0_4_ = local_118;
    fStack_110 = fStack_520 * auVar18._8_4_ * 3.0;
    auVar17._8_4_ = fStack_110;
    fStack_10c = fStack_51c * auVar18._12_4_ * 3.0;
    auVar17._12_4_ = fStack_10c;
    local_528._0_4_ = (float)local_528._0_4_ * auVar18._16_4_ * 3.0;
    auVar17._16_4_ = local_528._0_4_;
    local_528._4_4_ = (float)local_528._4_4_ * auVar18._20_4_ * 3.0;
    auVar17._20_4_ = local_528._4_4_;
    fStack_520 = fStack_520 * auVar18._24_4_ * 3.0;
    auVar17._24_4_ = fStack_520;
    auVar17._28_4_ = fStack_51c;
    auVar20 = vperm2f128_avx(auVar251,auVar251,1);
    auVar20 = vshufps_avx(auVar20,auVar251,0x30);
    auVar94 = vshufps_avx(auVar251,auVar20,0x29);
    auVar18 = vsubps_avx(auVar251,auVar16);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar16 = vshufps_avx(auVar18,auVar20,0x29);
    auVar18 = vsubps_avx(auVar272,auVar17);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar17 = vshufps_avx(auVar18,auVar20,0x29);
    auVar21 = vsubps_avx(auVar251,local_78);
    auVar22 = vsubps_avx(auVar94,auVar93);
    fVar95 = auVar22._0_4_ + auVar21._0_4_;
    fVar97 = auVar22._4_4_ + auVar21._4_4_;
    fVar151 = auVar22._8_4_ + auVar21._8_4_;
    fVar175 = auVar22._12_4_ + auVar21._12_4_;
    fVar177 = auVar22._16_4_ + auVar21._16_4_;
    fVar179 = auVar22._20_4_ + auVar21._20_4_;
    fVar181 = auVar22._24_4_ + auVar21._24_4_;
    auVar18 = vperm2f128_avx(local_98,local_98,1);
    auVar18 = vshufps_avx(auVar18,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar272,auVar272,1);
    auVar18 = vshufps_avx(auVar18,auVar272,0x30);
    auVar171 = vshufps_avx(auVar272,auVar18,0x29);
    auVar18 = vsubps_avx(auVar272,local_98);
    auVar198 = vsubps_avx(auVar171,local_b8);
    fVar200 = auVar18._0_4_ + auVar198._0_4_;
    fVar203 = auVar18._4_4_ + auVar198._4_4_;
    fVar205 = auVar18._8_4_ + auVar198._8_4_;
    fVar206 = auVar18._12_4_ + auVar198._12_4_;
    fVar150 = auVar18._16_4_ + auVar198._16_4_;
    fVar286 = auVar18._20_4_ + auVar198._20_4_;
    fVar287 = auVar18._24_4_ + auVar198._24_4_;
    fVar301 = auVar18._28_4_;
    auVar18._4_4_ = local_98._4_4_ * fVar97;
    auVar18._0_4_ = local_98._0_4_ * fVar95;
    auVar18._8_4_ = local_98._8_4_ * fVar151;
    auVar18._12_4_ = local_98._12_4_ * fVar175;
    auVar18._16_4_ = local_98._16_4_ * fVar177;
    auVar18._20_4_ = local_98._20_4_ * fVar179;
    auVar18._24_4_ = local_98._24_4_ * fVar181;
    auVar18._28_4_ = fVar301;
    auVar23._4_4_ = fVar203 * local_78._4_4_;
    auVar23._0_4_ = fVar200 * local_78._0_4_;
    auVar23._8_4_ = fVar205 * local_78._8_4_;
    auVar23._12_4_ = fVar206 * local_78._12_4_;
    auVar23._16_4_ = fVar150 * local_78._16_4_;
    auVar23._20_4_ = fVar286 * local_78._20_4_;
    auVar23._24_4_ = fVar287 * local_78._24_4_;
    auVar23._28_4_ = auVar20._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar23);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar19._28_4_;
    fVar309 = local_98._0_4_ + fVar309;
    fVar202 = local_98._4_4_ + fVar202;
    fVar310 = local_98._8_4_ + fVar310;
    fVar207 = local_98._12_4_ + fVar207;
    fVar311 = local_98._16_4_ + fVar311;
    fVar312 = local_98._20_4_ + fVar312;
    fVar313 = local_98._24_4_ + fVar313;
    auVar19._4_4_ = fVar202 * fVar97;
    auVar19._0_4_ = fVar309 * fVar95;
    auVar19._8_4_ = fVar310 * fVar151;
    auVar19._12_4_ = fVar207 * fVar175;
    auVar19._16_4_ = fVar311 * fVar177;
    auVar19._20_4_ = fVar312 * fVar179;
    auVar19._24_4_ = fVar313 * fVar181;
    auVar19._28_4_ = fVar301;
    auVar24._4_4_ = fVar203 * fStack_d4;
    auVar24._0_4_ = fVar200 * local_d8;
    auVar24._8_4_ = fVar205 * fStack_d0;
    auVar24._12_4_ = fVar206 * fStack_cc;
    auVar24._16_4_ = fVar150 * fStack_c8;
    auVar24._20_4_ = fVar286 * fStack_c4;
    auVar24._24_4_ = fVar287 * fStack_c0;
    auVar24._28_4_ = fStack_bc;
    auVar19 = vsubps_avx(auVar19,auVar24);
    auVar25._4_4_ = auVar92._4_4_ * fVar97;
    auVar25._0_4_ = auVar92._0_4_ * fVar95;
    auVar25._8_4_ = auVar92._8_4_ * fVar151;
    auVar25._12_4_ = auVar92._12_4_ * fVar175;
    auVar25._16_4_ = auVar92._16_4_ * fVar177;
    auVar25._20_4_ = auVar92._20_4_ * fVar179;
    auVar25._24_4_ = auVar92._24_4_ * fVar181;
    auVar25._28_4_ = fVar301;
    local_588 = auVar91._0_4_;
    fStack_584 = auVar91._4_4_;
    fStack_580 = auVar91._8_4_;
    fStack_57c = auVar91._12_4_;
    fStack_578 = auVar91._16_4_;
    fStack_574 = auVar91._20_4_;
    fStack_570 = auVar91._24_4_;
    auVar26._4_4_ = fVar203 * fStack_584;
    auVar26._0_4_ = fVar200 * local_588;
    auVar26._8_4_ = fVar205 * fStack_580;
    auVar26._12_4_ = fVar206 * fStack_57c;
    auVar26._16_4_ = fVar150 * fStack_578;
    auVar26._20_4_ = fVar286 * fStack_574;
    auVar26._24_4_ = fVar287 * fStack_570;
    auVar26._28_4_ = 0x40400000;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_b8._4_4_ * fVar97;
    auVar27._0_4_ = local_b8._0_4_ * fVar95;
    auVar27._8_4_ = local_b8._8_4_ * fVar151;
    auVar27._12_4_ = local_b8._12_4_ * fVar175;
    auVar27._16_4_ = local_b8._16_4_ * fVar177;
    auVar27._20_4_ = local_b8._20_4_ * fVar179;
    auVar27._24_4_ = local_b8._24_4_ * fVar181;
    auVar27._28_4_ = fVar301;
    auVar28._4_4_ = auVar93._4_4_ * fVar203;
    auVar28._0_4_ = auVar93._0_4_ * fVar200;
    auVar28._8_4_ = auVar93._8_4_ * fVar205;
    auVar28._12_4_ = auVar93._12_4_ * fVar206;
    auVar28._16_4_ = auVar93._16_4_ * fVar150;
    auVar28._20_4_ = auVar93._20_4_ * fVar286;
    auVar28._24_4_ = auVar93._24_4_ * fVar287;
    auVar28._28_4_ = local_b8._28_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar272._4_4_ * fVar97;
    auVar29._0_4_ = auVar272._0_4_ * fVar95;
    auVar29._8_4_ = auVar272._8_4_ * fVar151;
    auVar29._12_4_ = auVar272._12_4_ * fVar175;
    auVar29._16_4_ = auVar272._16_4_ * fVar177;
    auVar29._20_4_ = auVar272._20_4_ * fVar179;
    auVar29._24_4_ = auVar272._24_4_ * fVar181;
    auVar29._28_4_ = fVar301;
    auVar30._4_4_ = fVar203 * auVar251._4_4_;
    auVar30._0_4_ = fVar200 * auVar251._0_4_;
    auVar30._8_4_ = fVar205 * auVar251._8_4_;
    auVar30._12_4_ = fVar206 * auVar251._12_4_;
    auVar30._16_4_ = fVar150 * auVar251._16_4_;
    auVar30._20_4_ = fVar286 * auVar251._20_4_;
    auVar30._24_4_ = fVar287 * auVar251._24_4_;
    auVar30._28_4_ = auVar92._28_4_;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_f8 = auVar251._0_4_ + local_f8;
    fStack_f4 = auVar251._4_4_ + fStack_f4;
    fStack_f0 = auVar251._8_4_ + fStack_f0;
    fStack_ec = auVar251._12_4_ + fStack_ec;
    fStack_e8 = auVar251._16_4_ + fStack_e8;
    fStack_e4 = auVar251._20_4_ + fStack_e4;
    fStack_e0 = auVar251._24_4_ + fStack_e0;
    fStack_dc = auVar251._28_4_ + auVar236._28_4_;
    local_118 = auVar272._0_4_ + local_118;
    fStack_114 = auVar272._4_4_ + fStack_114;
    fStack_110 = auVar272._8_4_ + fStack_110;
    fStack_10c = auVar272._12_4_ + fStack_10c;
    fStack_108 = auVar272._16_4_ + (float)local_528._0_4_;
    fStack_104 = auVar272._20_4_ + (float)local_528._4_4_;
    fStack_100 = auVar272._24_4_ + fStack_520;
    fStack_fc = auVar272._28_4_ + fStack_51c;
    auVar31._4_4_ = fStack_114 * fVar97;
    auVar31._0_4_ = local_118 * fVar95;
    auVar31._8_4_ = fStack_110 * fVar151;
    auVar31._12_4_ = fStack_10c * fVar175;
    auVar31._16_4_ = fStack_108 * fVar177;
    auVar31._20_4_ = fStack_104 * fVar179;
    auVar31._24_4_ = fStack_100 * fVar181;
    auVar31._28_4_ = auVar272._28_4_ + fStack_51c;
    auVar32._4_4_ = fStack_f4 * fVar203;
    auVar32._0_4_ = local_f8 * fVar200;
    auVar32._8_4_ = fStack_f0 * fVar205;
    auVar32._12_4_ = fStack_ec * fVar206;
    auVar32._16_4_ = fStack_e8 * fVar150;
    auVar32._20_4_ = fStack_e4 * fVar286;
    auVar32._24_4_ = fStack_e0 * fVar287;
    auVar32._28_4_ = fStack_dc;
    auVar26 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar17._4_4_ * fVar97;
    auVar33._0_4_ = auVar17._0_4_ * fVar95;
    auVar33._8_4_ = auVar17._8_4_ * fVar151;
    auVar33._12_4_ = auVar17._12_4_ * fVar175;
    auVar33._16_4_ = auVar17._16_4_ * fVar177;
    auVar33._20_4_ = auVar17._20_4_ * fVar179;
    auVar33._24_4_ = auVar17._24_4_ * fVar181;
    auVar33._28_4_ = fStack_dc;
    auVar34._4_4_ = fVar203 * auVar16._4_4_;
    auVar34._0_4_ = fVar200 * auVar16._0_4_;
    auVar34._8_4_ = fVar205 * auVar16._8_4_;
    auVar34._12_4_ = fVar206 * auVar16._12_4_;
    auVar34._16_4_ = fVar150 * auVar16._16_4_;
    auVar34._20_4_ = fVar286 * auVar16._20_4_;
    auVar34._24_4_ = fVar287 * auVar16._24_4_;
    auVar34._28_4_ = auVar16._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar171._4_4_ * fVar97;
    auVar35._0_4_ = auVar171._0_4_ * fVar95;
    auVar35._8_4_ = auVar171._8_4_ * fVar151;
    auVar35._12_4_ = auVar171._12_4_ * fVar175;
    auVar35._16_4_ = auVar171._16_4_ * fVar177;
    auVar35._20_4_ = auVar171._20_4_ * fVar179;
    auVar35._24_4_ = auVar171._24_4_ * fVar181;
    auVar35._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar22._4_4_ = auVar94._4_4_ * fVar203;
    auVar22._0_4_ = auVar94._0_4_ * fVar200;
    auVar22._8_4_ = auVar94._8_4_ * fVar205;
    auVar22._12_4_ = auVar94._12_4_ * fVar206;
    auVar22._16_4_ = auVar94._16_4_ * fVar150;
    auVar22._20_4_ = auVar94._20_4_ * fVar286;
    auVar22._24_4_ = auVar94._24_4_ * fVar287;
    auVar22._28_4_ = fVar301 + auVar198._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar20 = vminps_avx(auVar18,auVar19);
    auVar91 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar23,auVar24);
    auVar91 = vmaxps_avx(auVar91,auVar20);
    auVar19 = vminps_avx(auVar25,auVar26);
    auVar20 = vmaxps_avx(auVar25,auVar26);
    auVar21 = vminps_avx(auVar27,auVar22);
    auVar19 = vminps_avx(auVar19,auVar21);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar27,auVar22);
    auVar20 = vmaxps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar91,auVar20);
    auVar91 = vcmpps_avx(auVar19,local_138,2);
    auVar20 = vcmpps_avx(auVar20,local_158,5);
    auVar91 = vandps_avx(auVar20,auVar91);
    auVar20 = local_228 & auVar91;
    uVar64 = 0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar93,local_78);
      auVar18 = vsubps_avx(auVar94,auVar251);
      fVar97 = auVar20._0_4_ + auVar18._0_4_;
      fVar151 = auVar20._4_4_ + auVar18._4_4_;
      fVar175 = auVar20._8_4_ + auVar18._8_4_;
      fVar177 = auVar20._12_4_ + auVar18._12_4_;
      fVar179 = auVar20._16_4_ + auVar18._16_4_;
      fVar181 = auVar20._20_4_ + auVar18._20_4_;
      fVar200 = auVar20._24_4_ + auVar18._24_4_;
      auVar19 = vsubps_avx(local_b8,local_98);
      auVar21 = vsubps_avx(auVar171,auVar272);
      fVar203 = auVar19._0_4_ + auVar21._0_4_;
      fVar205 = auVar19._4_4_ + auVar21._4_4_;
      fVar206 = auVar19._8_4_ + auVar21._8_4_;
      fVar150 = auVar19._12_4_ + auVar21._12_4_;
      fVar286 = auVar19._16_4_ + auVar21._16_4_;
      fVar287 = auVar19._20_4_ + auVar21._20_4_;
      fVar301 = auVar19._24_4_ + auVar21._24_4_;
      fVar95 = auVar21._28_4_;
      auVar36._4_4_ = local_98._4_4_ * fVar151;
      auVar36._0_4_ = local_98._0_4_ * fVar97;
      auVar36._8_4_ = local_98._8_4_ * fVar175;
      auVar36._12_4_ = local_98._12_4_ * fVar177;
      auVar36._16_4_ = local_98._16_4_ * fVar179;
      auVar36._20_4_ = local_98._20_4_ * fVar181;
      auVar36._24_4_ = local_98._24_4_ * fVar200;
      auVar36._28_4_ = local_98._28_4_;
      auVar37._4_4_ = local_78._4_4_ * fVar205;
      auVar37._0_4_ = local_78._0_4_ * fVar203;
      auVar37._8_4_ = local_78._8_4_ * fVar206;
      auVar37._12_4_ = local_78._12_4_ * fVar150;
      auVar37._16_4_ = local_78._16_4_ * fVar286;
      auVar37._20_4_ = local_78._20_4_ * fVar287;
      auVar37._24_4_ = local_78._24_4_ * fVar301;
      auVar37._28_4_ = local_78._28_4_;
      auVar21 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar202 * fVar151;
      auVar38._0_4_ = fVar309 * fVar97;
      auVar38._8_4_ = fVar310 * fVar175;
      auVar38._12_4_ = fVar207 * fVar177;
      auVar38._16_4_ = fVar311 * fVar179;
      auVar38._20_4_ = fVar312 * fVar181;
      auVar38._24_4_ = fVar313 * fVar200;
      auVar38._28_4_ = local_98._28_4_;
      auVar39._4_4_ = fVar205 * fStack_d4;
      auVar39._0_4_ = fVar203 * local_d8;
      auVar39._8_4_ = fVar206 * fStack_d0;
      auVar39._12_4_ = fVar150 * fStack_cc;
      auVar39._16_4_ = fVar286 * fStack_c8;
      auVar39._20_4_ = fVar287 * fStack_c4;
      auVar39._24_4_ = fVar301 * fStack_c0;
      auVar39._28_4_ = fVar95;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar151 * auVar92._4_4_;
      auVar40._0_4_ = fVar97 * auVar92._0_4_;
      auVar40._8_4_ = fVar175 * auVar92._8_4_;
      auVar40._12_4_ = fVar177 * auVar92._12_4_;
      auVar40._16_4_ = fVar179 * auVar92._16_4_;
      auVar40._20_4_ = fVar181 * auVar92._20_4_;
      auVar40._24_4_ = fVar200 * auVar92._24_4_;
      auVar40._28_4_ = fVar95;
      auVar41._4_4_ = fVar205 * fStack_584;
      auVar41._0_4_ = fVar203 * local_588;
      auVar41._8_4_ = fVar206 * fStack_580;
      auVar41._12_4_ = fVar150 * fStack_57c;
      auVar41._16_4_ = fVar286 * fStack_578;
      auVar41._20_4_ = fVar287 * fStack_574;
      auVar41._24_4_ = fVar301 * fStack_570;
      auVar41._28_4_ = local_98._28_4_ + auVar197._28_4_;
      auVar92 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_b8._4_4_ * fVar151;
      auVar42._0_4_ = local_b8._0_4_ * fVar97;
      auVar42._8_4_ = local_b8._8_4_ * fVar175;
      auVar42._12_4_ = local_b8._12_4_ * fVar177;
      auVar42._16_4_ = local_b8._16_4_ * fVar179;
      auVar42._20_4_ = local_b8._20_4_ * fVar181;
      auVar42._24_4_ = local_b8._24_4_ * fVar200;
      auVar42._28_4_ = local_98._28_4_ + auVar197._28_4_;
      auVar43._4_4_ = auVar93._4_4_ * fVar205;
      auVar43._0_4_ = auVar93._0_4_ * fVar203;
      auVar43._8_4_ = auVar93._8_4_ * fVar206;
      auVar43._12_4_ = auVar93._12_4_ * fVar150;
      auVar43._16_4_ = auVar93._16_4_ * fVar286;
      auVar43._20_4_ = auVar93._20_4_ * fVar287;
      uVar5 = auVar93._28_4_;
      auVar43._24_4_ = auVar93._24_4_ * fVar301;
      auVar43._28_4_ = uVar5;
      auVar93 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar272._4_4_ * fVar151;
      auVar44._0_4_ = auVar272._0_4_ * fVar97;
      auVar44._8_4_ = auVar272._8_4_ * fVar175;
      auVar44._12_4_ = auVar272._12_4_ * fVar177;
      auVar44._16_4_ = auVar272._16_4_ * fVar179;
      auVar44._20_4_ = auVar272._20_4_ * fVar181;
      auVar44._24_4_ = auVar272._24_4_ * fVar200;
      auVar44._28_4_ = auVar272._28_4_;
      auVar45._4_4_ = auVar251._4_4_ * fVar205;
      auVar45._0_4_ = auVar251._0_4_ * fVar203;
      auVar45._8_4_ = auVar251._8_4_ * fVar206;
      auVar45._12_4_ = auVar251._12_4_ * fVar150;
      auVar45._16_4_ = auVar251._16_4_ * fVar286;
      auVar45._20_4_ = auVar251._20_4_ * fVar287;
      auVar45._24_4_ = auVar251._24_4_ * fVar301;
      auVar45._28_4_ = auVar251._28_4_;
      auVar198 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar151 * fStack_114;
      auVar46._0_4_ = fVar97 * local_118;
      auVar46._8_4_ = fVar175 * fStack_110;
      auVar46._12_4_ = fVar177 * fStack_10c;
      auVar46._16_4_ = fVar179 * fStack_108;
      auVar46._20_4_ = fVar181 * fStack_104;
      auVar46._24_4_ = fVar200 * fStack_100;
      auVar46._28_4_ = auVar272._28_4_;
      auVar47._4_4_ = fVar205 * fStack_f4;
      auVar47._0_4_ = fVar203 * local_f8;
      auVar47._8_4_ = fVar206 * fStack_f0;
      auVar47._12_4_ = fVar150 * fStack_ec;
      auVar47._16_4_ = fVar286 * fStack_e8;
      auVar47._20_4_ = fVar287 * fStack_e4;
      auVar47._24_4_ = fVar301 * fStack_e0;
      auVar47._28_4_ = uVar5;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar151 * auVar17._4_4_;
      auVar48._0_4_ = fVar97 * auVar17._0_4_;
      auVar48._8_4_ = fVar175 * auVar17._8_4_;
      auVar48._12_4_ = fVar177 * auVar17._12_4_;
      auVar48._16_4_ = fVar179 * auVar17._16_4_;
      auVar48._20_4_ = fVar181 * auVar17._20_4_;
      auVar48._24_4_ = fVar200 * auVar17._24_4_;
      auVar48._28_4_ = uVar5;
      auVar49._4_4_ = fVar205 * auVar16._4_4_;
      auVar49._0_4_ = fVar203 * auVar16._0_4_;
      auVar49._8_4_ = fVar206 * auVar16._8_4_;
      auVar49._12_4_ = fVar150 * auVar16._12_4_;
      auVar49._16_4_ = fVar286 * auVar16._16_4_;
      auVar49._20_4_ = fVar287 * auVar16._20_4_;
      auVar49._24_4_ = fVar301 * auVar16._24_4_;
      auVar49._28_4_ = local_b8._28_4_;
      auVar16 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar171._4_4_ * fVar151;
      auVar50._0_4_ = auVar171._0_4_ * fVar97;
      auVar50._8_4_ = auVar171._8_4_ * fVar175;
      auVar50._12_4_ = auVar171._12_4_ * fVar177;
      auVar50._16_4_ = auVar171._16_4_ * fVar179;
      auVar50._20_4_ = auVar171._20_4_ * fVar181;
      auVar50._24_4_ = auVar171._24_4_ * fVar200;
      auVar50._28_4_ = auVar20._28_4_ + auVar18._28_4_;
      auVar51._4_4_ = auVar94._4_4_ * fVar205;
      auVar51._0_4_ = auVar94._0_4_ * fVar203;
      auVar51._8_4_ = auVar94._8_4_ * fVar206;
      auVar51._12_4_ = auVar94._12_4_ * fVar150;
      auVar51._16_4_ = auVar94._16_4_ * fVar286;
      auVar51._20_4_ = auVar94._20_4_ * fVar287;
      auVar51._24_4_ = auVar94._24_4_ * fVar301;
      auVar51._28_4_ = auVar19._28_4_ + fVar95;
      auVar94 = vsubps_avx(auVar50,auVar51);
      auVar18 = vminps_avx(auVar21,auVar22);
      auVar20 = vmaxps_avx(auVar21,auVar22);
      auVar19 = vminps_avx(auVar92,auVar93);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar92,auVar93);
      auVar20 = vmaxps_avx(auVar20,auVar18);
      auVar21 = vminps_avx(auVar198,auVar23);
      auVar18 = vmaxps_avx(auVar198,auVar23);
      auVar92 = vminps_avx(auVar16,auVar94);
      auVar21 = vminps_avx(auVar21,auVar92);
      auVar21 = vminps_avx(auVar19,auVar21);
      auVar19 = vmaxps_avx(auVar16,auVar94);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar20,auVar18);
      auVar20 = vcmpps_avx(auVar21,local_138,2);
      auVar18 = vcmpps_avx(auVar18,local_158,5);
      auVar20 = vandps_avx(auVar18,auVar20);
      auVar91 = vandps_avx(auVar91,local_228);
      auVar18 = auVar91 & auVar20;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar20,auVar91);
        uVar64 = vmovmskps_avx(auVar91);
      }
    }
    if (uVar64 != 0) {
      uVar68 = (ulong)uVar70;
      auStack_378[uVar68] = uVar64;
      uVar6 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar68 * 2) = uVar6;
      uVar66 = vmovlps_avx(_local_5e8);
      auStack_58[uVar68] = uVar66;
      uVar70 = uVar70 + 1;
    }
    auVar355 = ZEXT464(0) << 0x20;
    do {
      if (uVar70 == 0) {
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar90._4_4_ = uVar5;
        auVar90._0_4_ = uVar5;
        auVar90._8_4_ = uVar5;
        auVar90._12_4_ = uVar5;
        auVar115 = vcmpps_avx(local_348,auVar90,2);
        uVar65 = vmovmskps_avx(auVar115);
        uVar63 = uVar63 & (uint)local_410 & uVar65;
        if (uVar63 == 0) {
          return;
        }
        goto LAB_0108de2f;
      }
      uVar68 = (ulong)(uVar70 - 1);
      uVar64 = auStack_378[uVar68];
      fVar95 = afStack_208[uVar68 * 2];
      fVar97 = afStack_208[uVar68 * 2 + 1];
      register0x00001588 = 0;
      local_5e8 = (undefined1  [8])auStack_58[uVar68];
      uVar66 = 0;
      if (uVar64 != 0) {
        for (; (uVar64 >> uVar66 & 1) == 0; uVar66 = uVar66 + 1) {
        }
      }
      uVar64 = uVar64 - 1 & uVar64;
      auStack_378[uVar68] = uVar64;
      if (uVar64 == 0) {
        uVar70 = uVar70 - 1;
      }
      auVar212._8_4_ = 0x3f800000;
      auVar212._0_8_ = &DAT_3f8000003f800000;
      auVar212._12_4_ = 0x3f800000;
      fVar175 = (float)(uVar66 + 1) * 0.14285715;
      fVar151 = (1.0 - (float)uVar66 * 0.14285715) * fVar95 + fVar97 * (float)uVar66 * 0.14285715;
      fVar95 = (1.0 - fVar175) * fVar95 + fVar97 * fVar175;
      fVar97 = fVar95 - fVar151;
      if (0.16666667 <= fVar97) break;
      auVar115 = vshufps_avx(_local_5e8,_local_5e8,0x50);
      auVar293 = vsubps_avx(auVar212,auVar115);
      fVar175 = auVar115._0_4_;
      fVar177 = auVar115._4_4_;
      fVar179 = auVar115._8_4_;
      fVar181 = auVar115._12_4_;
      fVar200 = auVar293._0_4_;
      fVar203 = auVar293._4_4_;
      fVar205 = auVar293._8_4_;
      fVar206 = auVar293._12_4_;
      auVar161._0_4_ = auVar264._0_4_ * fVar175 + fVar200 * (float)local_4e8._0_4_;
      auVar161._4_4_ = auVar264._4_4_ * fVar177 + fVar203 * (float)local_4e8._4_4_;
      auVar161._8_4_ = auVar264._0_4_ * fVar179 + fVar205 * (float)local_4e8._0_4_;
      auVar161._12_4_ = auVar264._4_4_ * fVar181 + fVar206 * (float)local_4e8._4_4_;
      auVar189._0_4_ = auVar275._0_4_ * fVar175 + fVar200 * (float)local_388._0_4_;
      auVar189._4_4_ = auVar275._4_4_ * fVar177 + fVar203 * (float)local_388._4_4_;
      auVar189._8_4_ = auVar275._0_4_ * fVar179 + fVar205 * fStack_380;
      auVar189._12_4_ = auVar275._4_4_ * fVar181 + fVar206 * fStack_37c;
      auVar213._0_4_ = auVar295._0_4_ * fVar175 + fVar200 * auVar343._0_4_;
      auVar213._4_4_ = auVar295._4_4_ * fVar177 + fVar203 * auVar343._4_4_;
      auVar213._8_4_ = auVar295._0_4_ * fVar179 + fVar205 * auVar343._0_4_;
      auVar213._12_4_ = auVar295._4_4_ * fVar181 + fVar206 * auVar343._4_4_;
      auVar111._0_4_ = auVar86._0_4_ * fVar175 + auVar246._0_4_ * fVar200;
      auVar111._4_4_ = auVar86._4_4_ * fVar177 + auVar246._4_4_ * fVar203;
      auVar111._8_4_ = auVar86._0_4_ * fVar179 + auVar246._0_4_ * fVar205;
      auVar111._12_4_ = auVar86._4_4_ * fVar181 + auVar246._4_4_ * fVar206;
      auVar147._16_16_ = auVar161;
      auVar147._0_16_ = auVar161;
      auVar172._16_16_ = auVar189;
      auVar172._0_16_ = auVar189;
      auVar199._16_16_ = auVar213;
      auVar199._0_16_ = auVar213;
      auVar91 = vshufps_avx(ZEXT2032(CONCAT416(fVar95,ZEXT416((uint)fVar151))),
                            ZEXT2032(CONCAT416(fVar95,ZEXT416((uint)fVar151))),0);
      auVar20 = vsubps_avx(auVar172,auVar147);
      fVar175 = auVar91._0_4_;
      fVar177 = auVar91._4_4_;
      fVar179 = auVar91._8_4_;
      fVar181 = auVar91._12_4_;
      fVar200 = auVar91._16_4_;
      fVar203 = auVar91._20_4_;
      fVar205 = auVar91._24_4_;
      auVar148._0_4_ = auVar161._0_4_ + auVar20._0_4_ * fVar175;
      auVar148._4_4_ = auVar161._4_4_ + auVar20._4_4_ * fVar177;
      auVar148._8_4_ = auVar161._8_4_ + auVar20._8_4_ * fVar179;
      auVar148._12_4_ = auVar161._12_4_ + auVar20._12_4_ * fVar181;
      auVar148._16_4_ = auVar161._0_4_ + auVar20._16_4_ * fVar200;
      auVar148._20_4_ = auVar161._4_4_ + auVar20._20_4_ * fVar203;
      auVar148._24_4_ = auVar161._8_4_ + auVar20._24_4_ * fVar205;
      auVar148._28_4_ = auVar161._12_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar199,auVar172);
      auVar173._0_4_ = auVar189._0_4_ + auVar20._0_4_ * fVar175;
      auVar173._4_4_ = auVar189._4_4_ + auVar20._4_4_ * fVar177;
      auVar173._8_4_ = auVar189._8_4_ + auVar20._8_4_ * fVar179;
      auVar173._12_4_ = auVar189._12_4_ + auVar20._12_4_ * fVar181;
      auVar173._16_4_ = auVar189._0_4_ + auVar20._16_4_ * fVar200;
      auVar173._20_4_ = auVar189._4_4_ + auVar20._20_4_ * fVar203;
      auVar173._24_4_ = auVar189._8_4_ + auVar20._24_4_ * fVar205;
      auVar173._28_4_ = auVar189._12_4_ + auVar20._28_4_;
      auVar115 = vsubps_avx(auVar111,auVar213);
      auVar125._0_4_ = auVar213._0_4_ + auVar115._0_4_ * fVar175;
      auVar125._4_4_ = auVar213._4_4_ + auVar115._4_4_ * fVar177;
      auVar125._8_4_ = auVar213._8_4_ + auVar115._8_4_ * fVar179;
      auVar125._12_4_ = auVar213._12_4_ + auVar115._12_4_ * fVar181;
      auVar125._16_4_ = auVar213._0_4_ + auVar115._0_4_ * fVar200;
      auVar125._20_4_ = auVar213._4_4_ + auVar115._4_4_ * fVar203;
      auVar125._24_4_ = auVar213._8_4_ + auVar115._8_4_ * fVar205;
      auVar125._28_4_ = auVar213._12_4_ + auVar115._12_4_;
      auVar20 = vsubps_avx(auVar173,auVar148);
      auVar149._0_4_ = auVar148._0_4_ + fVar175 * auVar20._0_4_;
      auVar149._4_4_ = auVar148._4_4_ + fVar177 * auVar20._4_4_;
      auVar149._8_4_ = auVar148._8_4_ + fVar179 * auVar20._8_4_;
      auVar149._12_4_ = auVar148._12_4_ + fVar181 * auVar20._12_4_;
      auVar149._16_4_ = auVar148._16_4_ + fVar200 * auVar20._16_4_;
      auVar149._20_4_ = auVar148._20_4_ + fVar203 * auVar20._20_4_;
      auVar149._24_4_ = auVar148._24_4_ + fVar205 * auVar20._24_4_;
      auVar149._28_4_ = auVar148._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar125,auVar173);
      auVar126._0_4_ = auVar173._0_4_ + fVar175 * auVar20._0_4_;
      auVar126._4_4_ = auVar173._4_4_ + fVar177 * auVar20._4_4_;
      auVar126._8_4_ = auVar173._8_4_ + fVar179 * auVar20._8_4_;
      auVar126._12_4_ = auVar173._12_4_ + fVar181 * auVar20._12_4_;
      auVar126._16_4_ = auVar173._16_4_ + fVar200 * auVar20._16_4_;
      auVar126._20_4_ = auVar173._20_4_ + fVar203 * auVar20._20_4_;
      auVar126._24_4_ = auVar173._24_4_ + fVar205 * auVar20._24_4_;
      auVar126._28_4_ = auVar173._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar126,auVar149);
      auVar162._0_4_ = auVar149._0_4_ + fVar175 * auVar20._0_4_;
      auVar162._4_4_ = auVar149._4_4_ + fVar177 * auVar20._4_4_;
      auVar162._8_4_ = auVar149._8_4_ + fVar179 * auVar20._8_4_;
      auVar162._12_4_ = auVar149._12_4_ + fVar181 * auVar20._12_4_;
      auVar174._16_4_ = auVar149._16_4_ + fVar200 * auVar20._16_4_;
      auVar174._0_16_ = auVar162;
      auVar174._20_4_ = auVar149._20_4_ + fVar203 * auVar20._20_4_;
      auVar174._24_4_ = auVar149._24_4_ + fVar205 * auVar20._24_4_;
      auVar174._28_4_ = auVar149._28_4_ + auVar173._28_4_;
      fVar175 = auVar20._4_4_ * 3.0;
      auVar142 = auVar174._16_16_;
      auVar114 = vshufps_avx(ZEXT416((uint)(fVar97 * 0.33333334)),
                             ZEXT416((uint)(fVar97 * 0.33333334)),0);
      auVar276._0_4_ = auVar162._0_4_ + auVar114._0_4_ * auVar20._0_4_ * 3.0;
      auVar276._4_4_ = auVar162._4_4_ + auVar114._4_4_ * fVar175;
      auVar276._8_4_ = auVar162._8_4_ + auVar114._8_4_ * auVar20._8_4_ * 3.0;
      auVar276._12_4_ = auVar162._12_4_ + auVar114._12_4_ * auVar20._12_4_ * 3.0;
      auVar220 = vshufpd_avx(auVar162,auVar162,3);
      auVar168 = vshufpd_avx(auVar142,auVar142,3);
      auVar115 = vsubps_avx(auVar220,auVar162);
      auVar293 = vsubps_avx(auVar168,auVar142);
      auVar112._0_4_ = auVar115._0_4_ + auVar293._0_4_;
      auVar112._4_4_ = auVar115._4_4_ + auVar293._4_4_;
      auVar112._8_4_ = auVar115._8_4_ + auVar293._8_4_;
      auVar112._12_4_ = auVar115._12_4_ + auVar293._12_4_;
      auVar115 = vmovshdup_avx(auVar162);
      auVar293 = vmovshdup_avx(auVar276);
      auVar167 = vshufps_avx(auVar112,auVar112,0);
      auVar88 = vshufps_avx(auVar112,auVar112,0x55);
      fVar203 = auVar88._0_4_;
      fVar205 = auVar88._4_4_;
      fVar206 = auVar88._8_4_;
      fVar150 = auVar88._12_4_;
      fVar177 = auVar167._0_4_;
      fVar179 = auVar167._4_4_;
      fVar181 = auVar167._8_4_;
      fVar200 = auVar167._12_4_;
      auVar265._0_4_ = fVar177 * auVar162._0_4_ + fVar203 * auVar115._0_4_;
      auVar265._4_4_ = fVar179 * auVar162._4_4_ + fVar205 * auVar115._4_4_;
      auVar265._8_4_ = fVar181 * auVar162._8_4_ + fVar206 * auVar115._8_4_;
      auVar265._12_4_ = fVar200 * auVar162._12_4_ + fVar150 * auVar115._12_4_;
      auVar277._0_4_ = auVar276._0_4_ * fVar177 + fVar203 * auVar293._0_4_;
      auVar277._4_4_ = auVar276._4_4_ * fVar179 + fVar205 * auVar293._4_4_;
      auVar277._8_4_ = auVar276._8_4_ * fVar181 + fVar206 * auVar293._8_4_;
      auVar277._12_4_ = auVar276._12_4_ * fVar200 + fVar150 * auVar293._12_4_;
      auVar293 = vshufps_avx(auVar265,auVar265,0xe8);
      auVar167 = vshufps_avx(auVar277,auVar277,0xe8);
      auVar115 = vcmpps_avx(auVar293,auVar167,1);
      uVar64 = vextractps_avx(auVar115,0);
      auVar88 = auVar277;
      if ((uVar64 & 1) == 0) {
        auVar88 = auVar265;
      }
      auVar113._0_4_ = auVar114._0_4_ * auVar20._16_4_ * 3.0;
      auVar113._4_4_ = auVar114._4_4_ * fVar175;
      auVar113._8_4_ = auVar114._8_4_ * auVar20._24_4_ * 3.0;
      auVar113._12_4_ = auVar114._12_4_ * auVar91._28_4_;
      auVar72 = vsubps_avx(auVar142,auVar113);
      auVar114 = vmovshdup_avx(auVar72);
      auVar142 = vmovshdup_avx(auVar142);
      fVar175 = auVar72._0_4_;
      fVar286 = auVar72._4_4_;
      auVar352._0_4_ = fVar177 * fVar175 + fVar203 * auVar114._0_4_;
      auVar352._4_4_ = fVar179 * fVar286 + fVar205 * auVar114._4_4_;
      auVar352._8_4_ = fVar181 * auVar72._8_4_ + fVar206 * auVar114._8_4_;
      auVar352._12_4_ = fVar200 * auVar72._12_4_ + fVar150 * auVar114._12_4_;
      auVar335._0_4_ = fVar177 * auVar174._16_4_ + fVar203 * auVar142._0_4_;
      auVar335._4_4_ = fVar179 * auVar174._20_4_ + fVar205 * auVar142._4_4_;
      auVar335._8_4_ = fVar181 * auVar174._24_4_ + fVar206 * auVar142._8_4_;
      auVar335._12_4_ = fVar200 * auVar174._28_4_ + fVar150 * auVar142._12_4_;
      auVar142 = vshufps_avx(auVar352,auVar352,0xe8);
      auVar15 = vshufps_avx(auVar335,auVar335,0xe8);
      auVar114 = vcmpps_avx(auVar142,auVar15,1);
      uVar64 = vextractps_avx(auVar114,0);
      auVar73 = auVar335;
      if ((uVar64 & 1) == 0) {
        auVar73 = auVar352;
      }
      auVar88 = vmaxss_avx(auVar73,auVar88);
      auVar293 = vminps_avx(auVar293,auVar167);
      auVar167 = vminps_avx(auVar142,auVar15);
      auVar167 = vminps_avx(auVar293,auVar167);
      auVar115 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vblendps_avx(auVar115,auVar114,2);
      auVar114 = vpslld_avx(auVar115,0x1f);
      auVar115 = vshufpd_avx(auVar277,auVar277,1);
      auVar115 = vinsertps_avx(auVar115,auVar335,0x9c);
      auVar293 = vshufpd_avx(auVar265,auVar265,1);
      auVar293 = vinsertps_avx(auVar293,auVar352,0x9c);
      auVar115 = vblendvps_avx(auVar293,auVar115,auVar114);
      auVar293 = vmovshdup_avx(auVar115);
      auVar115 = vmaxss_avx(auVar293,auVar115);
      fVar181 = auVar167._0_4_;
      auVar293 = vmovshdup_avx(auVar167);
      fVar179 = auVar115._0_4_;
      fVar200 = auVar293._0_4_;
      fVar177 = auVar88._0_4_;
      if ((0.0001 <= fVar181) || (fVar179 <= -0.0001)) {
        if ((-0.0001 < fVar177 && fVar200 < 0.0001) ||
           ((fVar181 < 0.0001 && -0.0001 < fVar177 || (fVar200 < 0.0001 && -0.0001 < fVar179))))
        goto LAB_0108f4ea;
LAB_0108ff66:
        bVar52 = true;
        auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0108f4ea:
        auVar355 = ZEXT464(0) << 0x20;
        auVar114 = vcmpps_avx(auVar167,ZEXT416(0) << 0x20,1);
        auVar293 = vcmpss_avx(auVar88,ZEXT416(0),1);
        auVar344._8_4_ = 0x3f800000;
        auVar344._0_8_ = &DAT_3f8000003f800000;
        auVar344._12_4_ = 0x3f800000;
        auVar214._8_4_ = 0xbf800000;
        auVar214._0_8_ = 0xbf800000bf800000;
        auVar214._12_4_ = 0xbf800000;
        auVar293 = vblendvps_avx(auVar344,auVar214,auVar293);
        auVar114 = vblendvps_avx(auVar344,auVar214,auVar114);
        auVar142 = vcmpss_avx(auVar293,auVar114,4);
        auVar142 = vpshufd_avx(ZEXT416(auVar142._0_4_ & 1),0x50);
        auVar142 = vpslld_avx(auVar142,0x1f);
        auVar142 = vpsrad_avx(auVar142,0x1f);
        auVar142 = vpandn_avx(auVar142,_DAT_02020eb0);
        auVar15 = vmovshdup_avx(auVar114);
        fVar203 = auVar15._0_4_;
        if ((auVar114._0_4_ != fVar203) || (NAN(auVar114._0_4_) || NAN(fVar203))) {
          if ((fVar200 != fVar181) || (NAN(fVar200) || NAN(fVar181))) {
            fVar181 = -fVar181 / (fVar200 - fVar181);
            auVar114 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar181) * 0.0 + fVar181)));
          }
          else {
            auVar114 = vcmpss_avx(auVar167,ZEXT416(0),0);
            auVar114 = vpshufd_avx(ZEXT416(auVar114._0_4_ & 1),0x50);
            auVar114 = vpslld_avx(auVar114,0x1f);
            auVar114 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar114);
          }
          auVar15 = vcmpps_avx(auVar142,auVar114,1);
          auVar167 = vblendps_avx(auVar142,auVar114,2);
          auVar114 = vblendps_avx(auVar114,auVar142,2);
          auVar142 = vblendvps_avx(auVar114,auVar167,auVar15);
        }
        auVar115 = vcmpss_avx(auVar115,ZEXT416(0),1);
        auVar143._8_4_ = 0xbf800000;
        auVar143._0_8_ = 0xbf800000bf800000;
        auVar143._12_4_ = 0xbf800000;
        auVar115 = vblendvps_avx(auVar344,auVar143,auVar115);
        fVar181 = auVar115._0_4_;
        if ((auVar293._0_4_ != fVar181) || (NAN(auVar293._0_4_) || NAN(fVar181))) {
          if ((fVar179 != fVar177) || (NAN(fVar179) || NAN(fVar177))) {
            fVar177 = -fVar177 / (fVar179 - fVar177);
            auVar115 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar177) * 0.0 + fVar177)));
          }
          else {
            auVar115 = vcmpss_avx(auVar88,ZEXT416(0),0);
            auVar115 = vpshufd_avx(ZEXT416(auVar115._0_4_ & 1),0x50);
            auVar115 = vpslld_avx(auVar115,0x1f);
            auVar115 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar115);
          }
          auVar114 = vcmpps_avx(auVar142,auVar115,1);
          auVar293 = vblendps_avx(auVar142,auVar115,2);
          auVar115 = vblendps_avx(auVar115,auVar142,2);
          auVar142 = vblendvps_avx(auVar115,auVar293,auVar114);
        }
        if ((fVar203 != fVar181) || (NAN(fVar203) || NAN(fVar181))) {
          auVar115 = vcmpps_avx(auVar142,auVar344,1);
          auVar293 = vinsertps_avx(auVar142,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar215._4_12_ = auVar142._4_12_;
          auVar215._0_4_ = 0x3f800000;
          auVar142 = vblendvps_avx(auVar215,auVar293,auVar115);
        }
        auVar115 = vcmpps_avx(auVar142,_DAT_01fec6f0,1);
        auVar53._12_4_ = 0;
        auVar53._0_12_ = auVar142._4_12_;
        auVar293 = vinsertps_avx(auVar142,ZEXT416(0x3f800000),0x10);
        auVar115 = vblendvps_avx(auVar293,auVar53 << 0x20,auVar115);
        auVar293 = vmovshdup_avx(auVar115);
        bVar52 = true;
        if (auVar115._0_4_ <= auVar293._0_4_) {
          auVar116._0_4_ = auVar115._0_4_ + -0.1;
          auVar116._4_4_ = auVar115._4_4_ + 0.1;
          auVar116._8_4_ = auVar115._8_4_ + 0.0;
          auVar116._12_4_ = auVar115._12_4_ + 0.0;
          auVar114 = vshufpd_avx(auVar276,auVar276,3);
          auVar163._8_8_ = 0x3f80000000000000;
          auVar163._0_8_ = 0x3f80000000000000;
          auVar115 = vcmpps_avx(auVar116,auVar163,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar116._4_12_;
          auVar293 = vinsertps_avx(auVar116,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar115 = vblendvps_avx(auVar293,auVar54 << 0x20,auVar115);
          auVar293 = vshufpd_avx(auVar72,auVar72,3);
          auVar167 = vshufps_avx(auVar115,auVar115,0x50);
          auVar88 = vsubps_avx(auVar344,auVar167);
          local_458 = auVar220._0_4_;
          fStack_454 = auVar220._4_4_;
          fStack_450 = auVar220._8_4_;
          fStack_44c = auVar220._12_4_;
          fVar177 = auVar167._0_4_;
          fVar179 = auVar167._4_4_;
          fVar181 = auVar167._8_4_;
          fVar200 = auVar167._12_4_;
          local_568 = auVar168._0_4_;
          fStack_564 = auVar168._4_4_;
          fStack_560 = auVar168._8_4_;
          fStack_55c = auVar168._12_4_;
          fVar203 = auVar88._0_4_;
          fVar205 = auVar88._4_4_;
          fVar206 = auVar88._8_4_;
          fVar150 = auVar88._12_4_;
          auVar144._0_4_ = fVar177 * local_458 + fVar203 * auVar162._0_4_;
          auVar144._4_4_ = fVar179 * fStack_454 + fVar205 * auVar162._4_4_;
          auVar144._8_4_ = fVar181 * fStack_450 + fVar206 * auVar162._0_4_;
          auVar144._12_4_ = fVar200 * fStack_44c + fVar150 * auVar162._4_4_;
          auVar190._0_4_ = fVar177 * auVar114._0_4_ + fVar203 * auVar276._0_4_;
          auVar190._4_4_ = fVar179 * auVar114._4_4_ + fVar205 * auVar276._4_4_;
          auVar190._8_4_ = fVar181 * auVar114._8_4_ + fVar206 * auVar276._0_4_;
          auVar190._12_4_ = fVar200 * auVar114._12_4_ + fVar150 * auVar276._4_4_;
          auVar248._0_4_ = fVar177 * auVar293._0_4_ + fVar203 * fVar175;
          auVar248._4_4_ = fVar179 * auVar293._4_4_ + fVar205 * fVar286;
          auVar248._8_4_ = fVar181 * auVar293._8_4_ + fVar206 * fVar175;
          auVar248._12_4_ = fVar200 * auVar293._12_4_ + fVar150 * fVar286;
          auVar266._0_4_ = fVar177 * local_568 + fVar203 * auVar174._16_4_;
          auVar266._4_4_ = fVar179 * fStack_564 + fVar205 * auVar174._20_4_;
          auVar266._8_4_ = fVar181 * fStack_560 + fVar206 * auVar174._16_4_;
          auVar266._12_4_ = fVar200 * fStack_55c + fVar150 * auVar174._20_4_;
          auVar168 = vsubps_avx(auVar344,auVar115);
          auVar293 = vmovshdup_avx(_local_5e8);
          auVar220 = vmovsldup_avx(_local_5e8);
          local_5e8._0_4_ = auVar168._0_4_ * auVar220._0_4_ + auVar293._0_4_ * auVar115._0_4_;
          local_5e8._4_4_ = auVar168._4_4_ * auVar220._4_4_ + auVar293._4_4_ * auVar115._4_4_;
          fStack_5e0 = auVar168._8_4_ * auVar220._8_4_ + auVar293._8_4_ * auVar115._8_4_;
          fStack_5dc = auVar168._12_4_ * auVar220._12_4_ + auVar293._12_4_ * auVar115._12_4_;
          auVar72 = vmovshdup_avx(_local_5e8);
          auVar115 = vsubps_avx(auVar190,auVar144);
          auVar216._0_4_ = auVar115._0_4_ * 3.0;
          auVar216._4_4_ = auVar115._4_4_ * 3.0;
          auVar216._8_4_ = auVar115._8_4_ * 3.0;
          auVar216._12_4_ = auVar115._12_4_ * 3.0;
          auVar115 = vsubps_avx(auVar248,auVar190);
          auVar231._0_4_ = auVar115._0_4_ * 3.0;
          auVar231._4_4_ = auVar115._4_4_ * 3.0;
          auVar231._8_4_ = auVar115._8_4_ * 3.0;
          auVar231._12_4_ = auVar115._12_4_ * 3.0;
          auVar115 = vsubps_avx(auVar266,auVar248);
          auVar278._0_4_ = auVar115._0_4_ * 3.0;
          auVar278._4_4_ = auVar115._4_4_ * 3.0;
          auVar278._8_4_ = auVar115._8_4_ * 3.0;
          auVar278._12_4_ = auVar115._12_4_ * 3.0;
          auVar293 = vminps_avx(auVar231,auVar278);
          auVar115 = vmaxps_avx(auVar231,auVar278);
          auVar293 = vminps_avx(auVar216,auVar293);
          auVar115 = vmaxps_avx(auVar216,auVar115);
          auVar220 = vshufpd_avx(auVar293,auVar293,3);
          auVar168 = vshufpd_avx(auVar115,auVar115,3);
          auVar293 = vminps_avx(auVar293,auVar220);
          auVar115 = vmaxps_avx(auVar115,auVar168);
          auVar220 = vshufps_avx(ZEXT416((uint)(1.0 / fVar97)),ZEXT416((uint)(1.0 / fVar97)),0);
          auVar217._0_4_ = auVar220._0_4_ * auVar293._0_4_;
          auVar217._4_4_ = auVar220._4_4_ * auVar293._4_4_;
          auVar217._8_4_ = auVar220._8_4_ * auVar293._8_4_;
          auVar217._12_4_ = auVar220._12_4_ * auVar293._12_4_;
          auVar232._0_4_ = auVar115._0_4_ * auVar220._0_4_;
          auVar232._4_4_ = auVar115._4_4_ * auVar220._4_4_;
          auVar232._8_4_ = auVar115._8_4_ * auVar220._8_4_;
          auVar232._12_4_ = auVar115._12_4_ * auVar220._12_4_;
          auVar88 = ZEXT416((uint)(1.0 / (auVar72._0_4_ - (float)local_5e8._0_4_)));
          auVar115 = vshufpd_avx(auVar144,auVar144,3);
          auVar293 = vshufpd_avx(auVar190,auVar190,3);
          auVar220 = vshufpd_avx(auVar248,auVar248,3);
          auVar168 = vshufpd_avx(auVar266,auVar266,3);
          auVar115 = vsubps_avx(auVar115,auVar144);
          auVar114 = vsubps_avx(auVar293,auVar190);
          auVar167 = vsubps_avx(auVar220,auVar248);
          auVar168 = vsubps_avx(auVar168,auVar266);
          auVar293 = vminps_avx(auVar115,auVar114);
          auVar115 = vmaxps_avx(auVar115,auVar114);
          auVar220 = vminps_avx(auVar167,auVar168);
          auVar220 = vminps_avx(auVar293,auVar220);
          auVar293 = vmaxps_avx(auVar167,auVar168);
          auVar115 = vmaxps_avx(auVar115,auVar293);
          auVar293 = vshufps_avx(auVar88,auVar88,0);
          auVar296._0_4_ = auVar293._0_4_ * auVar220._0_4_;
          auVar296._4_4_ = auVar293._4_4_ * auVar220._4_4_;
          auVar296._8_4_ = auVar293._8_4_ * auVar220._8_4_;
          auVar296._12_4_ = auVar293._12_4_ * auVar220._12_4_;
          auVar304._0_4_ = auVar293._0_4_ * auVar115._0_4_;
          auVar304._4_4_ = auVar293._4_4_ * auVar115._4_4_;
          auVar304._8_4_ = auVar293._8_4_ * auVar115._8_4_;
          auVar304._12_4_ = auVar293._12_4_ * auVar115._12_4_;
          auVar115 = vmovsldup_avx(_local_5e8);
          auVar249._4_12_ = auVar115._4_12_;
          auVar249._0_4_ = fVar151;
          auVar267._4_12_ = local_5e8._4_12_;
          auVar267._0_4_ = fVar95;
          auVar89._0_4_ = (fVar95 + fVar151) * 0.5;
          auVar89._4_4_ = ((float)local_5e8._4_4_ + auVar115._4_4_) * 0.5;
          auVar89._8_4_ = (fStack_5e0 + auVar115._8_4_) * 0.5;
          auVar89._12_4_ = (fStack_5dc + auVar115._12_4_) * 0.5;
          auVar115 = vshufps_avx(auVar89,auVar89,0);
          fVar175 = auVar115._0_4_;
          fVar177 = auVar115._4_4_;
          fVar179 = auVar115._8_4_;
          fVar181 = auVar115._12_4_;
          local_5d8 = auVar261._0_4_;
          fStack_5d4 = auVar261._4_4_;
          fStack_5d0 = auVar261._8_4_;
          fStack_5cc = auVar261._12_4_;
          auVar191._0_4_ = fVar175 * (float)local_238._0_4_ + local_5d8;
          auVar191._4_4_ = fVar177 * (float)local_238._4_4_ + fStack_5d4;
          auVar191._8_4_ = fVar179 * fStack_230 + fStack_5d0;
          auVar191._12_4_ = fVar181 * fStack_22c + fStack_5cc;
          local_4f8 = auVar14._0_4_;
          fStack_4f4 = auVar14._4_4_;
          fStack_4f0 = auVar14._8_4_;
          fStack_4ec = auVar14._12_4_;
          auVar279._0_4_ = fVar175 * (float)local_248._0_4_ + local_4f8;
          auVar279._4_4_ = fVar177 * (float)local_248._4_4_ + fStack_4f4;
          auVar279._8_4_ = fVar179 * fStack_240 + fStack_4f0;
          auVar279._12_4_ = fVar181 * fStack_23c + fStack_4ec;
          local_508 = auVar138._0_4_;
          fStack_504 = auVar138._4_4_;
          fStack_500 = auVar138._8_4_;
          fStack_4fc = auVar138._12_4_;
          auVar320._0_4_ = fVar175 * (float)local_258._0_4_ + local_508;
          auVar320._4_4_ = fVar177 * (float)local_258._4_4_ + fStack_504;
          auVar320._8_4_ = fVar179 * fStack_250 + fStack_500;
          auVar320._12_4_ = fVar181 * fStack_24c + fStack_4fc;
          auVar115 = vsubps_avx(auVar279,auVar191);
          auVar192._0_4_ = auVar115._0_4_ * fVar175 + auVar191._0_4_;
          auVar192._4_4_ = auVar115._4_4_ * fVar177 + auVar191._4_4_;
          auVar192._8_4_ = auVar115._8_4_ * fVar179 + auVar191._8_4_;
          auVar192._12_4_ = auVar115._12_4_ * fVar181 + auVar191._12_4_;
          auVar115 = vsubps_avx(auVar320,auVar279);
          auVar280._0_4_ = auVar279._0_4_ + auVar115._0_4_ * fVar175;
          auVar280._4_4_ = auVar279._4_4_ + auVar115._4_4_ * fVar177;
          auVar280._8_4_ = auVar279._8_4_ + auVar115._8_4_ * fVar179;
          auVar280._12_4_ = auVar279._12_4_ + auVar115._12_4_ * fVar181;
          auVar115 = vsubps_avx(auVar280,auVar192);
          fVar175 = auVar192._0_4_ + auVar115._0_4_ * fVar175;
          fVar177 = auVar192._4_4_ + auVar115._4_4_ * fVar177;
          auVar145._0_8_ = CONCAT44(fVar177,fVar175);
          auVar145._8_4_ = auVar192._8_4_ + auVar115._8_4_ * fVar179;
          auVar145._12_4_ = auVar192._12_4_ + auVar115._12_4_ * fVar181;
          fVar179 = auVar115._0_4_ * 3.0;
          fVar181 = auVar115._4_4_ * 3.0;
          auVar193._0_8_ = CONCAT44(fVar181,fVar179);
          auVar193._8_4_ = auVar115._8_4_ * 3.0;
          auVar193._12_4_ = auVar115._12_4_ * 3.0;
          auVar281._8_8_ = auVar145._0_8_;
          auVar281._0_8_ = auVar145._0_8_;
          auVar115 = vshufpd_avx(auVar145,auVar145,3);
          auVar293 = vshufps_avx(auVar89,auVar89,0x55);
          auVar167 = vsubps_avx(auVar115,auVar281);
          auVar282._0_4_ = auVar293._0_4_ * auVar167._0_4_ + fVar175;
          auVar282._4_4_ = auVar293._4_4_ * auVar167._4_4_ + fVar177;
          auVar282._8_4_ = auVar293._8_4_ * auVar167._8_4_ + fVar175;
          auVar282._12_4_ = auVar293._12_4_ * auVar167._12_4_ + fVar177;
          auVar336._8_8_ = auVar193._0_8_;
          auVar336._0_8_ = auVar193._0_8_;
          auVar115 = vshufpd_avx(auVar193,auVar193,1);
          auVar115 = vsubps_avx(auVar115,auVar336);
          auVar194._0_4_ = fVar179 + auVar293._0_4_ * auVar115._0_4_;
          auVar194._4_4_ = fVar181 + auVar293._4_4_ * auVar115._4_4_;
          auVar194._8_4_ = fVar179 + auVar293._8_4_ * auVar115._8_4_;
          auVar194._12_4_ = fVar181 + auVar293._12_4_ * auVar115._12_4_;
          auVar293 = vmovshdup_avx(auVar194);
          auVar337._0_8_ = auVar293._0_8_ ^ 0x8000000080000000;
          auVar337._8_4_ = auVar293._8_4_ ^ 0x80000000;
          auVar337._12_4_ = auVar293._12_4_ ^ 0x80000000;
          auVar220 = vmovshdup_avx(auVar167);
          auVar115 = vunpcklps_avx(auVar220,auVar337);
          auVar168 = vshufps_avx(auVar115,auVar337,4);
          auVar146._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
          auVar146._8_4_ = -auVar167._8_4_;
          auVar146._12_4_ = -auVar167._12_4_;
          auVar115 = vmovlhps_avx(auVar146,auVar194);
          auVar114 = vshufps_avx(auVar115,auVar194,8);
          auVar115 = ZEXT416((uint)(auVar220._0_4_ * auVar194._0_4_ -
                                   auVar293._0_4_ * auVar167._0_4_));
          auVar293 = vshufps_avx(auVar115,auVar115,0);
          auVar115 = vdivps_avx(auVar168,auVar293);
          auVar293 = vdivps_avx(auVar114,auVar293);
          auVar114 = vinsertps_avx(auVar217,auVar296,0x1c);
          auVar167 = vinsertps_avx(auVar232,auVar304,0x1c);
          auVar88 = vinsertps_avx(auVar296,auVar217,0x4c);
          auVar142 = vinsertps_avx(auVar304,auVar232,0x4c);
          auVar220 = vmovsldup_avx(auVar115);
          auVar305._0_4_ = auVar220._0_4_ * auVar114._0_4_;
          auVar305._4_4_ = auVar220._4_4_ * auVar114._4_4_;
          auVar305._8_4_ = auVar220._8_4_ * auVar114._8_4_;
          auVar305._12_4_ = auVar220._12_4_ * auVar114._12_4_;
          auVar297._0_4_ = auVar220._0_4_ * auVar167._0_4_;
          auVar297._4_4_ = auVar220._4_4_ * auVar167._4_4_;
          auVar297._8_4_ = auVar220._8_4_ * auVar167._8_4_;
          auVar297._12_4_ = auVar220._12_4_ * auVar167._12_4_;
          auVar168 = vminps_avx(auVar305,auVar297);
          auVar220 = vmaxps_avx(auVar297,auVar305);
          auVar15 = vmovsldup_avx(auVar293);
          auVar353._0_4_ = auVar15._0_4_ * auVar88._0_4_;
          auVar353._4_4_ = auVar15._4_4_ * auVar88._4_4_;
          auVar353._8_4_ = auVar15._8_4_ * auVar88._8_4_;
          auVar353._12_4_ = auVar15._12_4_ * auVar88._12_4_;
          auVar298._0_4_ = auVar15._0_4_ * auVar142._0_4_;
          auVar298._4_4_ = auVar15._4_4_ * auVar142._4_4_;
          auVar298._8_4_ = auVar15._8_4_ * auVar142._8_4_;
          auVar298._12_4_ = auVar15._12_4_ * auVar142._12_4_;
          auVar15 = vminps_avx(auVar353,auVar298);
          auVar117._0_4_ = auVar168._0_4_ + auVar15._0_4_;
          auVar117._4_4_ = auVar168._4_4_ + auVar15._4_4_;
          auVar117._8_4_ = auVar168._8_4_ + auVar15._8_4_;
          auVar117._12_4_ = auVar168._12_4_ + auVar15._12_4_;
          auVar168 = vmaxps_avx(auVar298,auVar353);
          auVar15 = vsubps_avx(auVar249,auVar89);
          auVar73 = vsubps_avx(auVar267,auVar89);
          auVar268._0_4_ = auVar220._0_4_ + auVar168._0_4_;
          auVar268._4_4_ = auVar220._4_4_ + auVar168._4_4_;
          auVar268._8_4_ = auVar220._8_4_ + auVar168._8_4_;
          auVar268._12_4_ = auVar220._12_4_ + auVar168._12_4_;
          auVar306._8_8_ = 0x3f800000;
          auVar306._0_8_ = 0x3f800000;
          auVar220 = vsubps_avx(auVar306,auVar268);
          auVar168 = vsubps_avx(auVar306,auVar117);
          fVar205 = auVar15._0_4_;
          auVar307._0_4_ = fVar205 * auVar220._0_4_;
          fVar206 = auVar15._4_4_;
          auVar307._4_4_ = fVar206 * auVar220._4_4_;
          fVar150 = auVar15._8_4_;
          auVar307._8_4_ = fVar150 * auVar220._8_4_;
          fVar286 = auVar15._12_4_;
          auVar307._12_4_ = fVar286 * auVar220._12_4_;
          fVar179 = auVar73._0_4_;
          auVar269._0_4_ = auVar220._0_4_ * fVar179;
          fVar181 = auVar73._4_4_;
          auVar269._4_4_ = auVar220._4_4_ * fVar181;
          fVar200 = auVar73._8_4_;
          auVar269._8_4_ = auVar220._8_4_ * fVar200;
          fVar203 = auVar73._12_4_;
          auVar269._12_4_ = auVar220._12_4_ * fVar203;
          auVar345._0_4_ = fVar205 * auVar168._0_4_;
          auVar345._4_4_ = fVar206 * auVar168._4_4_;
          auVar345._8_4_ = fVar150 * auVar168._8_4_;
          auVar345._12_4_ = fVar286 * auVar168._12_4_;
          auVar118._0_4_ = fVar179 * auVar168._0_4_;
          auVar118._4_4_ = fVar181 * auVar168._4_4_;
          auVar118._8_4_ = fVar200 * auVar168._8_4_;
          auVar118._12_4_ = fVar203 * auVar168._12_4_;
          auVar220 = vminps_avx(auVar307,auVar345);
          auVar168 = vminps_avx(auVar269,auVar118);
          auVar15 = vminps_avx(auVar220,auVar168);
          auVar220 = vmaxps_avx(auVar345,auVar307);
          auVar168 = vmaxps_avx(auVar118,auVar269);
          auVar73 = vshufps_avx(auVar89,auVar89,0x54);
          auVar168 = vmaxps_avx(auVar168,auVar220);
          auVar74 = vshufps_avx(auVar282,auVar282,0);
          auVar100 = vshufps_avx(auVar282,auVar282,0x55);
          auVar220 = vhaddps_avx(auVar15,auVar15);
          auVar168 = vhaddps_avx(auVar168,auVar168);
          auVar270._0_4_ = auVar74._0_4_ * auVar115._0_4_ + auVar100._0_4_ * auVar293._0_4_;
          auVar270._4_4_ = auVar74._4_4_ * auVar115._4_4_ + auVar100._4_4_ * auVar293._4_4_;
          auVar270._8_4_ = auVar74._8_4_ * auVar115._8_4_ + auVar100._8_4_ * auVar293._8_4_;
          auVar270._12_4_ = auVar74._12_4_ * auVar115._12_4_ + auVar100._12_4_ * auVar293._12_4_;
          auVar15 = vsubps_avx(auVar73,auVar270);
          fVar175 = auVar15._0_4_ + auVar220._0_4_;
          fVar177 = auVar15._0_4_ + auVar168._0_4_;
          auVar220 = vmaxss_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar175));
          auVar168 = vminss_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar95));
          if (auVar220._0_4_ <= auVar168._0_4_) {
            auVar220 = vmovshdup_avx(auVar115);
            auVar164._0_4_ = auVar114._0_4_ * auVar220._0_4_;
            auVar164._4_4_ = auVar114._4_4_ * auVar220._4_4_;
            auVar164._8_4_ = auVar114._8_4_ * auVar220._8_4_;
            auVar164._12_4_ = auVar114._12_4_ * auVar220._12_4_;
            auVar119._0_4_ = auVar167._0_4_ * auVar220._0_4_;
            auVar119._4_4_ = auVar167._4_4_ * auVar220._4_4_;
            auVar119._8_4_ = auVar167._8_4_ * auVar220._8_4_;
            auVar119._12_4_ = auVar167._12_4_ * auVar220._12_4_;
            auVar168 = vminps_avx(auVar164,auVar119);
            auVar220 = vmaxps_avx(auVar119,auVar164);
            auVar114 = vmovshdup_avx(auVar293);
            auVar218._0_4_ = auVar114._0_4_ * auVar88._0_4_;
            auVar218._4_4_ = auVar114._4_4_ * auVar88._4_4_;
            auVar218._8_4_ = auVar114._8_4_ * auVar88._8_4_;
            auVar218._12_4_ = auVar114._12_4_ * auVar88._12_4_;
            auVar165._0_4_ = auVar114._0_4_ * auVar142._0_4_;
            auVar165._4_4_ = auVar114._4_4_ * auVar142._4_4_;
            auVar165._8_4_ = auVar114._8_4_ * auVar142._8_4_;
            auVar165._12_4_ = auVar114._12_4_ * auVar142._12_4_;
            auVar114 = vminps_avx(auVar218,auVar165);
            auVar233._0_4_ = auVar168._0_4_ + auVar114._0_4_;
            auVar233._4_4_ = auVar168._4_4_ + auVar114._4_4_;
            auVar233._8_4_ = auVar168._8_4_ + auVar114._8_4_;
            auVar233._12_4_ = auVar168._12_4_ + auVar114._12_4_;
            auVar168 = vmaxps_avx(auVar165,auVar218);
            auVar120._0_4_ = auVar220._0_4_ + auVar168._0_4_;
            auVar120._4_4_ = auVar220._4_4_ + auVar168._4_4_;
            auVar120._8_4_ = auVar220._8_4_ + auVar168._8_4_;
            auVar120._12_4_ = auVar220._12_4_ + auVar168._12_4_;
            auVar220 = vsubps_avx(auVar163,auVar120);
            auVar168 = vsubps_avx(auVar163,auVar233);
            auVar219._0_4_ = fVar205 * auVar220._0_4_;
            auVar219._4_4_ = fVar206 * auVar220._4_4_;
            auVar219._8_4_ = fVar150 * auVar220._8_4_;
            auVar219._12_4_ = fVar286 * auVar220._12_4_;
            auVar234._0_4_ = fVar205 * auVar168._0_4_;
            auVar234._4_4_ = fVar206 * auVar168._4_4_;
            auVar234._8_4_ = fVar150 * auVar168._8_4_;
            auVar234._12_4_ = fVar286 * auVar168._12_4_;
            auVar121._0_4_ = fVar179 * auVar220._0_4_;
            auVar121._4_4_ = fVar181 * auVar220._4_4_;
            auVar121._8_4_ = fVar200 * auVar220._8_4_;
            auVar121._12_4_ = fVar203 * auVar220._12_4_;
            auVar166._0_4_ = fVar179 * auVar168._0_4_;
            auVar166._4_4_ = fVar181 * auVar168._4_4_;
            auVar166._8_4_ = fVar200 * auVar168._8_4_;
            auVar166._12_4_ = fVar203 * auVar168._12_4_;
            auVar220 = vminps_avx(auVar219,auVar234);
            auVar168 = vminps_avx(auVar121,auVar166);
            auVar220 = vminps_avx(auVar220,auVar168);
            auVar168 = vmaxps_avx(auVar234,auVar219);
            auVar114 = vmaxps_avx(auVar166,auVar121);
            auVar220 = vhaddps_avx(auVar220,auVar220);
            auVar168 = vmaxps_avx(auVar114,auVar168);
            auVar168 = vhaddps_avx(auVar168,auVar168);
            auVar114 = vmovshdup_avx(auVar15);
            auVar167 = ZEXT416((uint)(auVar114._0_4_ + auVar220._0_4_));
            auVar220 = vmaxss_avx(_local_5e8,auVar167);
            auVar114 = ZEXT416((uint)(auVar114._0_4_ + auVar168._0_4_));
            auVar168 = vminss_avx(auVar114,auVar72);
            auVar346._8_4_ = 0x7fffffff;
            auVar346._0_8_ = 0x7fffffff7fffffff;
            auVar346._12_4_ = 0x7fffffff;
            if (auVar220._0_4_ <= auVar168._0_4_) {
              uVar64 = 0;
              auVar355 = ZEXT864(0) << 0x20;
              if ((fVar151 < fVar175) && (fVar177 < fVar95)) {
                auVar220 = vcmpps_avx(auVar114,auVar72,1);
                auVar168 = vcmpps_avx(_local_5e8,auVar167,1);
                auVar220 = vandps_avx(auVar168,auVar220);
                uVar64 = auVar220._0_4_;
              }
              if ((uVar70 < 4 && 0.001 <= fVar97) && (uVar64 & 1) == 0) {
                bVar52 = false;
              }
              else {
                lVar67 = 200;
                do {
                  fVar175 = auVar15._0_4_;
                  fVar97 = 1.0 - fVar175;
                  auVar220 = ZEXT416((uint)(fVar97 * fVar97 * fVar97));
                  auVar220 = vshufps_avx(auVar220,auVar220,0);
                  auVar168 = ZEXT416((uint)(fVar175 * 3.0 * fVar97 * fVar97));
                  auVar168 = vshufps_avx(auVar168,auVar168,0);
                  auVar114 = ZEXT416((uint)(fVar97 * fVar175 * fVar175 * 3.0));
                  auVar114 = vshufps_avx(auVar114,auVar114,0);
                  auVar167 = ZEXT416((uint)(fVar175 * fVar175 * fVar175));
                  auVar167 = vshufps_avx(auVar167,auVar167,0);
                  fVar97 = local_5d8 * auVar220._0_4_ +
                           local_4f8 * auVar168._0_4_ +
                           (float)local_398._0_4_ * auVar167._0_4_ + local_508 * auVar114._0_4_;
                  fVar175 = fStack_5d4 * auVar220._4_4_ +
                            fStack_4f4 * auVar168._4_4_ +
                            (float)local_398._4_4_ * auVar167._4_4_ + fStack_504 * auVar114._4_4_;
                  auVar122._0_8_ = CONCAT44(fVar175,fVar97);
                  auVar122._8_4_ =
                       fStack_5d0 * auVar220._8_4_ +
                       fStack_4f0 * auVar168._8_4_ +
                       fStack_390 * auVar167._8_4_ + fStack_500 * auVar114._8_4_;
                  auVar122._12_4_ =
                       fStack_5cc * auVar220._12_4_ +
                       fStack_4ec * auVar168._12_4_ +
                       fStack_38c * auVar167._12_4_ + fStack_4fc * auVar114._12_4_;
                  auVar169._8_8_ = auVar122._0_8_;
                  auVar169._0_8_ = auVar122._0_8_;
                  auVar168 = vshufpd_avx(auVar122,auVar122,1);
                  auVar220 = vmovshdup_avx(auVar15);
                  auVar168 = vsubps_avx(auVar168,auVar169);
                  auVar123._0_4_ = auVar220._0_4_ * auVar168._0_4_ + fVar97;
                  auVar123._4_4_ = auVar220._4_4_ * auVar168._4_4_ + fVar175;
                  auVar123._8_4_ = auVar220._8_4_ * auVar168._8_4_ + fVar97;
                  auVar123._12_4_ = auVar220._12_4_ * auVar168._12_4_ + fVar175;
                  auVar220 = vshufps_avx(auVar123,auVar123,0);
                  auVar168 = vshufps_avx(auVar123,auVar123,0x55);
                  auVar170._0_4_ = auVar115._0_4_ * auVar220._0_4_ + auVar293._0_4_ * auVar168._0_4_
                  ;
                  auVar170._4_4_ = auVar115._4_4_ * auVar220._4_4_ + auVar293._4_4_ * auVar168._4_4_
                  ;
                  auVar170._8_4_ = auVar115._8_4_ * auVar220._8_4_ + auVar293._8_4_ * auVar168._8_4_
                  ;
                  auVar170._12_4_ =
                       auVar115._12_4_ * auVar220._12_4_ + auVar293._12_4_ * auVar168._12_4_;
                  auVar15 = vsubps_avx(auVar15,auVar170);
                  auVar220 = vandps_avx(auVar346,auVar123);
                  auVar168 = vshufps_avx(auVar220,auVar220,0xf5);
                  auVar220 = vmaxss_avx(auVar168,auVar220);
                  if (auVar220._0_4_ < fVar71) {
                    fVar97 = auVar15._0_4_;
                    if ((0.0 <= fVar97) && (fVar97 <= 1.0)) {
                      auVar115 = vmovshdup_avx(auVar15);
                      fVar175 = auVar115._0_4_;
                      if ((0.0 <= fVar175) && (fVar175 <= 1.0)) {
                        auVar115 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar142 = vinsertps_avx(auVar115,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar115 = vdpps_avx(auVar142,local_268,0x7f);
                        auVar293 = vdpps_avx(auVar142,local_278,0x7f);
                        auVar220 = vdpps_avx(auVar142,local_288,0x7f);
                        auVar168 = vdpps_avx(auVar142,local_298,0x7f);
                        auVar114 = vdpps_avx(auVar142,local_2a8,0x7f);
                        auVar167 = vdpps_avx(auVar142,local_2b8,0x7f);
                        auVar88 = vdpps_avx(auVar142,local_2c8,0x7f);
                        auVar142 = vdpps_avx(auVar142,local_2d8,0x7f);
                        fVar203 = 1.0 - fVar175;
                        fVar205 = 1.0 - fVar97;
                        fVar177 = auVar15._4_4_;
                        fVar179 = auVar15._8_4_;
                        fVar181 = auVar15._12_4_;
                        fVar200 = fVar205 * fVar97 * fVar97 * 3.0;
                        auVar250._0_4_ = fVar97 * fVar97 * fVar97;
                        auVar250._4_4_ = fVar177 * fVar177 * fVar177;
                        auVar250._8_4_ = fVar179 * fVar179 * fVar179;
                        auVar250._12_4_ = fVar181 * fVar181 * fVar181;
                        fVar179 = fVar205 * fVar205 * fVar97 * 3.0;
                        fVar181 = fVar205 * fVar205 * fVar205;
                        fVar177 = fVar181 * (fVar203 * auVar115._0_4_ + fVar175 * auVar114._0_4_) +
                                  (fVar203 * auVar293._0_4_ + auVar167._0_4_ * fVar175) * fVar179 +
                                  fVar200 * (auVar88._0_4_ * fVar175 + fVar203 * auVar220._0_4_) +
                                  auVar250._0_4_ *
                                  (fVar203 * auVar168._0_4_ + fVar175 * auVar142._0_4_);
                        if (((fVar98 <= fVar177) &&
                            (fVar203 = *(float *)(ray + k * 4 + 0x80), fVar177 <= fVar203)) &&
                           (pGVar8 = (context->scene->geometries).items[uVar65].ptr,
                           (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar15,auVar15,0x55);
                          auVar283._8_4_ = 0x3f800000;
                          auVar283._0_8_ = &DAT_3f8000003f800000;
                          auVar283._12_4_ = 0x3f800000;
                          auVar115 = vsubps_avx(auVar283,local_1a8);
                          fVar206 = local_1a8._0_4_;
                          fVar150 = local_1a8._4_4_;
                          fVar286 = local_1a8._8_4_;
                          fVar287 = local_1a8._12_4_;
                          fVar301 = auVar115._0_4_;
                          fVar99 = auVar115._4_4_;
                          fVar127 = auVar115._8_4_;
                          fVar128 = auVar115._12_4_;
                          auVar299._0_4_ =
                               fVar206 * (float)local_3c8._0_4_ + fVar301 * (float)local_3a8._0_4_;
                          auVar299._4_4_ =
                               fVar150 * (float)local_3c8._4_4_ + fVar99 * (float)local_3a8._4_4_;
                          auVar299._8_4_ = fVar286 * fStack_3c0 + fVar127 * fStack_3a0;
                          auVar299._12_4_ = fVar287 * fStack_3bc + fVar128 * fStack_39c;
                          auVar308._0_4_ = fVar206 * (float)local_3d8._0_4_ + fVar301 * fVar208;
                          auVar308._4_4_ = fVar150 * (float)local_3d8._4_4_ + fVar99 * fVar224;
                          auVar308._8_4_ = fVar286 * fStack_3d0 + fVar127 * fVar176;
                          auVar308._12_4_ = fVar287 * fStack_3cc + fVar128 * fVar182;
                          auVar321._0_4_ = fVar206 * fVar223 + fVar301 * (float)local_3b8._0_4_;
                          auVar321._4_4_ = fVar150 * fVar152 + fVar99 * (float)local_3b8._4_4_;
                          auVar321._8_4_ = fVar286 * fVar180 + fVar127 * fStack_3b0;
                          auVar321._12_4_ = fVar287 * fVar204 + fVar128 * fStack_3ac;
                          auVar284._0_4_ = fVar206 * (float)local_2f8._0_4_ + fVar301 * fVar222;
                          auVar284._4_4_ = fVar150 * (float)local_2f8._4_4_ + fVar99 * fVar96;
                          auVar284._8_4_ = fVar286 * fStack_2f0 + fVar127 * fVar178;
                          auVar284._12_4_ = fVar287 * fStack_2ec + fVar128 * fVar201;
                          auVar168 = vsubps_avx(auVar308,auVar299);
                          auVar114 = vsubps_avx(auVar321,auVar308);
                          auVar167 = vsubps_avx(auVar284,auVar321);
                          local_1b8 = vshufps_avx(auVar15,auVar15,0);
                          fVar287 = local_1b8._0_4_;
                          fVar301 = local_1b8._4_4_;
                          fVar99 = local_1b8._8_4_;
                          fVar127 = local_1b8._12_4_;
                          auVar115 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                          fVar205 = auVar115._0_4_;
                          fVar206 = auVar115._4_4_;
                          fVar150 = auVar115._8_4_;
                          fVar286 = auVar115._12_4_;
                          auVar115 = vshufps_avx(auVar250,auVar250,0);
                          auVar293 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
                          auVar220 = vshufps_avx(ZEXT416((uint)fVar179),ZEXT416((uint)fVar179),0);
                          auVar235._0_4_ =
                               (fVar205 * (fVar205 * auVar168._0_4_ + fVar287 * auVar114._0_4_) +
                               fVar287 * (fVar205 * auVar114._0_4_ + fVar287 * auVar167._0_4_)) *
                               3.0;
                          auVar235._4_4_ =
                               (fVar206 * (fVar206 * auVar168._4_4_ + fVar301 * auVar114._4_4_) +
                               fVar301 * (fVar206 * auVar114._4_4_ + fVar301 * auVar167._4_4_)) *
                               3.0;
                          auVar235._8_4_ =
                               (fVar150 * (fVar150 * auVar168._8_4_ + fVar99 * auVar114._8_4_) +
                               fVar99 * (fVar150 * auVar114._8_4_ + fVar99 * auVar167._8_4_)) * 3.0;
                          auVar235._12_4_ =
                               (fVar286 * (fVar286 * auVar168._12_4_ + fVar127 * auVar114._12_4_) +
                               fVar127 * (fVar286 * auVar114._12_4_ + fVar127 * auVar167._12_4_)) *
                               3.0;
                          auVar168 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
                          auVar195._0_4_ =
                               auVar168._0_4_ * (float)local_308._0_4_ +
                               auVar220._0_4_ * (float)local_318._0_4_ +
                               auVar115._0_4_ * (float)local_338._0_4_ +
                               auVar293._0_4_ * (float)local_328._0_4_;
                          auVar195._4_4_ =
                               auVar168._4_4_ * (float)local_308._4_4_ +
                               auVar220._4_4_ * (float)local_318._4_4_ +
                               auVar115._4_4_ * (float)local_338._4_4_ +
                               auVar293._4_4_ * (float)local_328._4_4_;
                          auVar195._8_4_ =
                               auVar168._8_4_ * fStack_300 +
                               auVar220._8_4_ * fStack_310 +
                               auVar115._8_4_ * fStack_330 + auVar293._8_4_ * fStack_320;
                          auVar195._12_4_ =
                               auVar168._12_4_ * fStack_2fc +
                               auVar220._12_4_ * fStack_30c +
                               auVar115._12_4_ * fStack_32c + auVar293._12_4_ * fStack_31c;
                          auVar115 = vshufps_avx(auVar235,auVar235,0xc9);
                          auVar221._0_4_ = auVar195._0_4_ * auVar115._0_4_;
                          auVar221._4_4_ = auVar195._4_4_ * auVar115._4_4_;
                          auVar221._8_4_ = auVar195._8_4_ * auVar115._8_4_;
                          auVar221._12_4_ = auVar195._12_4_ * auVar115._12_4_;
                          auVar115 = vshufps_avx(auVar195,auVar195,0xc9);
                          auVar196._0_4_ = auVar235._0_4_ * auVar115._0_4_;
                          auVar196._4_4_ = auVar235._4_4_ * auVar115._4_4_;
                          auVar196._8_4_ = auVar235._8_4_ * auVar115._8_4_;
                          auVar196._12_4_ = auVar235._12_4_ * auVar115._12_4_;
                          auVar115 = vsubps_avx(auVar196,auVar221);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar177;
                            uVar5 = vextractps_avx(auVar115,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar5;
                            uVar5 = vextractps_avx(auVar115,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                            *(int *)(ray + k * 4 + 0xe0) = auVar115._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar97;
                            *(float *)(ray + k * 4 + 0x100) = fVar175;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_418;
                            *(uint *)(ray + k * 4 + 0x120) = uVar65;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar293 = vshufps_avx(auVar115,auVar115,0x55);
                            local_1d8 = vshufps_avx(auVar115,auVar115,0xaa);
                            local_1c8 = vshufps_avx(auVar115,auVar115,0);
                            local_1e8[0] = (RTCHitN)auVar293[0];
                            local_1e8[1] = (RTCHitN)auVar293[1];
                            local_1e8[2] = (RTCHitN)auVar293[2];
                            local_1e8[3] = (RTCHitN)auVar293[3];
                            local_1e8[4] = (RTCHitN)auVar293[4];
                            local_1e8[5] = (RTCHitN)auVar293[5];
                            local_1e8[6] = (RTCHitN)auVar293[6];
                            local_1e8[7] = (RTCHitN)auVar293[7];
                            local_1e8[8] = (RTCHitN)auVar293[8];
                            local_1e8[9] = (RTCHitN)auVar293[9];
                            local_1e8[10] = (RTCHitN)auVar293[10];
                            local_1e8[0xb] = (RTCHitN)auVar293[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar293[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar293[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar293[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar293[0xf];
                            local_198 = local_368._0_8_;
                            uStack_190 = local_368._8_8_;
                            local_188 = local_358._0_8_;
                            uStack_180 = local_358._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar177;
                            local_438 = *local_428;
                            uStack_430 = local_428[1];
                            local_408.valid = (int *)&local_438;
                            local_408.geometryUserPtr = pGVar8->userPtr;
                            local_408.context = context->user;
                            local_408.hit = local_1e8;
                            local_408.N = 4;
                            local_408.ray = (RTCRayN *)ray;
                            if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar8->intersectionFilterN)(&local_408);
                            }
                            auVar61._8_8_ = uStack_430;
                            auVar61._0_8_ = local_438;
                            if (auVar61 == (undefined1  [16])0x0) {
                              auVar355 = ZEXT1664(ZEXT816(0));
                              auVar115 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar115 = auVar115 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var13 = context->args->filter;
                              auVar355 = ZEXT1664(ZEXT816(0));
                              auVar115 = vpcmpeqd_avx(auVar61,auVar61);
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar355._0_8_ = (*p_Var13)(&local_408);
                                auVar355._8_56_ = extraout_var;
                                auVar115 = vpcmpeqd_avx(auVar355._0_16_,auVar355._0_16_);
                                auVar355 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar62._8_8_ = uStack_430;
                              auVar62._0_8_ = local_438;
                              auVar293 = vpcmpeqd_avx(auVar355._0_16_,auVar62);
                              auVar115 = auVar293 ^ auVar115;
                              auVar220 = vpcmpeqd_avx(auVar62,auVar62);
                              if (auVar62 != (undefined1  [16])0x0) {
                                auVar293 = auVar293 ^ auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    local_408.hit);
                                *(undefined1 (*) [16])(local_408.ray + 0xc0) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x10));
                                *(undefined1 (*) [16])(local_408.ray + 0xd0) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x20));
                                *(undefined1 (*) [16])(local_408.ray + 0xe0) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x30));
                                *(undefined1 (*) [16])(local_408.ray + 0xf0) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x40));
                                *(undefined1 (*) [16])(local_408.ray + 0x100) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x50));
                                *(undefined1 (*) [16])(local_408.ray + 0x110) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x60));
                                *(undefined1 (*) [16])(local_408.ray + 0x120) = auVar220;
                                auVar220 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x70));
                                *(undefined1 (*) [16])(local_408.ray + 0x130) = auVar220;
                                auVar293 = vmaskmovps_avx(auVar293,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x80));
                                *(undefined1 (*) [16])(local_408.ray + 0x140) = auVar293;
                              }
                            }
                            auVar124._8_8_ = 0x100000001;
                            auVar124._0_8_ = 0x100000001;
                            if ((auVar124 & auVar115) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar203;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar67 = lVar67 + -1;
                } while (lVar67 != 0);
              }
              goto LAB_0108ff53;
            }
          }
          goto LAB_0108ff66;
        }
      }
LAB_0108ff53:
    } while (bVar52);
    _local_5a8 = ZEXT416((uint)fVar151);
    local_2e8 = vinsertps_avx(_local_5a8,ZEXT416((uint)fVar95),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }